

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O3

bool embree::avx512::CurveNiIntersector1<4>::
     occluded_t<embree::avx512::SweepCurve1Intersector1<embree::CatmullRomCurveT>,embree::avx512::Occluded1Epilog1<true>>
               (Precalculations *pre,Ray *ray,RayQueryContext *context,Primitive *prim)

{
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar1;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar2;
  Primitive PVar3;
  Geometry *pGVar4;
  RTCFilterFunctionN p_Var5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  undefined1 auVar13 [16];
  undefined8 uVar14;
  undefined8 uVar15;
  ulong uVar16;
  undefined8 uVar17;
  int iVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  byte bVar52;
  byte bVar53;
  byte bVar54;
  byte bVar55;
  long lVar56;
  ulong uVar57;
  ulong uVar58;
  bool bVar59;
  bool bVar60;
  ulong uVar61;
  uint uVar62;
  uint uVar117;
  uint uVar118;
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  uint uVar120;
  uint uVar121;
  uint uVar122;
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  uint uVar119;
  uint uVar123;
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined4 uVar124;
  vint4 bi_2;
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [32];
  undefined1 auVar129 [16];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  vint4 bi_1;
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  vint4 bi;
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [32];
  undefined1 auVar177 [32];
  undefined1 auVar178 [32];
  undefined1 auVar179 [32];
  float fVar180;
  float fVar198;
  float fVar199;
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  float fVar200;
  float fVar201;
  float fVar202;
  float fVar203;
  undefined1 auVar197 [32];
  float fVar204;
  float fVar211;
  float fVar212;
  vint4 ai_2;
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  float fVar213;
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  float fVar214;
  float fVar215;
  undefined1 auVar209 [32];
  undefined1 auVar210 [32];
  vint4 ai;
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [32];
  vint4 ai_1;
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [32];
  undefined1 auVar229 [32];
  undefined1 auVar230 [32];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar231 [64];
  float fVar232;
  float fVar238;
  float fVar239;
  undefined1 auVar233 [16];
  float fVar240;
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [64];
  undefined1 auVar241 [28];
  float fVar242;
  undefined1 auVar243 [32];
  undefined1 auVar244 [64];
  undefined1 auVar245 [32];
  float s;
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [64];
  undefined1 auVar252 [64];
  undefined1 auVar253 [64];
  undefined1 auVar254 [64];
  undefined1 auVar255 [64];
  undefined1 auVar256 [64];
  undefined1 auVar257 [64];
  undefined1 auVar258 [64];
  undefined1 auVar259 [64];
  undefined1 auVar260 [64];
  undefined1 auVar261 [64];
  undefined1 auVar262 [64];
  RTCFilterFunctionNArguments args;
  BBox<embree::vfloat_impl<8>_> tp1;
  vfloatx_conflict vu0;
  vfloat<8> dOdO;
  StackEntry stack [3];
  int local_90c;
  int local_8f0;
  undefined2 local_8ea;
  ulong local_8e8;
  undefined1 local_8e0 [32];
  undefined1 local_8c0 [8];
  float fStack_8b8;
  float fStack_8b4;
  float fStack_8b0;
  float fStack_8ac;
  float fStack_8a8;
  float fStack_8a4;
  undefined1 local_8a0 [32];
  undefined1 local_880 [16];
  undefined1 local_870 [16];
  undefined1 local_860 [16];
  undefined4 local_848;
  uint local_844;
  undefined1 local_840 [32];
  undefined1 local_820 [32];
  undefined1 local_800 [32];
  undefined1 local_7e0 [32];
  RTCFilterFunctionNArguments local_7b0;
  undefined1 local_780 [32];
  undefined1 local_760 [32];
  undefined1 local_740 [32];
  undefined1 local_720 [32];
  undefined1 local_700 [32];
  undefined1 local_6e0 [32];
  undefined1 local_6c0 [32];
  undefined1 local_6a0 [8];
  float fStack_698;
  float fStack_694;
  float fStack_690;
  float fStack_68c;
  float fStack_688;
  undefined1 local_680 [32];
  undefined1 local_660 [32];
  undefined1 local_640 [32];
  undefined8 local_620;
  undefined4 local_618;
  float local_614;
  undefined4 local_610;
  undefined4 local_60c;
  undefined4 local_608;
  uint local_604;
  uint local_600;
  ulong local_5e8;
  undefined1 local_5e0 [8];
  float fStack_5d8;
  float fStack_5d4;
  float fStack_5d0;
  float fStack_5cc;
  float fStack_5c8;
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [8];
  float fStack_598;
  float fStack_594;
  undefined1 local_580 [32];
  undefined1 local_560 [32];
  undefined1 local_540 [32];
  undefined1 local_520 [32];
  undefined1 local_500 [32];
  undefined1 local_4d0 [16];
  undefined1 local_4c0 [16];
  float local_4b0;
  float fStack_4ac;
  float fStack_4a8;
  float fStack_4a4;
  undefined1 local_4a0 [16];
  Primitive *local_490;
  ulong local_488;
  undefined1 local_480 [32];
  undefined1 local_460 [32];
  undefined1 local_440 [32];
  undefined1 local_420 [32];
  undefined1 local_400 [32];
  undefined4 local_3e0;
  undefined4 uStack_3dc;
  undefined4 uStack_3d8;
  undefined4 uStack_3d4;
  undefined4 uStack_3d0;
  undefined4 uStack_3cc;
  undefined4 uStack_3c8;
  undefined4 uStack_3c4;
  float local_3c0;
  float fStack_3bc;
  float fStack_3b8;
  float fStack_3b4;
  float fStack_3b0;
  float fStack_3ac;
  float fStack_3a8;
  float fStack_3a4;
  undefined1 local_3a0 [16];
  undefined1 local_390 [16];
  undefined1 local_380 [32];
  undefined1 local_360 [32];
  undefined1 local_340 [32];
  undefined1 local_320 [8];
  float fStack_318;
  float fStack_314;
  float fStack_310;
  float fStack_30c;
  float fStack_308;
  float fStack_304;
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  undefined1 local_260 [32];
  undefined1 local_240 [32];
  undefined1 local_220 [8];
  float fStack_218;
  float fStack_214;
  float fStack_210;
  float fStack_20c;
  float fStack_208;
  undefined4 uStack_204;
  undefined1 local_200 [8];
  float fStack_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  float fStack_1e8;
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [32];
  undefined1 local_1a0 [32];
  byte abStack_180 [32];
  undefined1 auStack_160 [32];
  ulong uStack_140;
  int aiStack_138 [66];
  undefined1 auVar104 [32];
  undefined1 auVar237 [64];
  
  PVar3 = prim[1];
  uVar58 = (ulong)(byte)PVar3;
  fVar180 = *(float *)(prim + uVar58 * 0x19 + 0x12);
  auVar67 = vsubps_avx((undefined1  [16])(ray->org).field_0,
                       *(undefined1 (*) [16])(prim + uVar58 * 0x19 + 6));
  auVar181._0_4_ = fVar180 * auVar67._0_4_;
  auVar181._4_4_ = fVar180 * auVar67._4_4_;
  auVar181._8_4_ = fVar180 * auVar67._8_4_;
  auVar181._12_4_ = fVar180 * auVar67._12_4_;
  auVar125._0_4_ = fVar180 * (ray->dir).field_0.m128[0];
  auVar125._4_4_ = fVar180 * (ray->dir).field_0.m128[1];
  auVar125._8_4_ = fVar180 * (ray->dir).field_0.m128[2];
  auVar125._12_4_ = fVar180 * (ray->dir).field_0.m128[3];
  auVar67 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar58 * 4 + 6)));
  auVar67 = vcvtdq2ps_avx(auVar67);
  auVar65 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar58 * 5 + 6)));
  auVar65 = vcvtdq2ps_avx(auVar65);
  auVar68 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar58 * 6 + 6)));
  auVar73 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar58 * 0xb + 6)));
  auVar68 = vcvtdq2ps_avx(auVar68);
  auVar73 = vcvtdq2ps_avx(auVar73);
  auVar69 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)((uint)(byte)PVar3 * 0xc) + 6)));
  auVar69 = vcvtdq2ps_avx(auVar69);
  auVar70 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (uint)(byte)PVar3 * 0xc + uVar58 + 6)));
  auVar70 = vcvtdq2ps_avx(auVar70);
  uVar57 = (ulong)(uint)((int)(uVar58 * 9) * 2);
  auVar71 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar57 + 6)));
  auVar71 = vcvtdq2ps_avx(auVar71);
  auVar234 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar57 + uVar58 + 6)));
  auVar234 = vcvtdq2ps_avx(auVar234);
  uVar61 = (ulong)(uint)((int)(uVar58 * 5) << 2);
  auVar13 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar61 + 6)));
  auVar13 = vcvtdq2ps_avx(auVar13);
  auVar248._4_4_ = auVar125._0_4_;
  auVar248._0_4_ = auVar125._0_4_;
  auVar248._8_4_ = auVar125._0_4_;
  auVar248._12_4_ = auVar125._0_4_;
  auVar72 = vshufps_avx(auVar125,auVar125,0x55);
  auVar66 = vshufps_avx(auVar125,auVar125,0xaa);
  fVar180 = auVar66._0_4_;
  auVar160._0_4_ = fVar180 * auVar68._0_4_;
  fVar198 = auVar66._4_4_;
  auVar160._4_4_ = fVar198 * auVar68._4_4_;
  fVar199 = auVar66._8_4_;
  auVar160._8_4_ = fVar199 * auVar68._8_4_;
  fVar200 = auVar66._12_4_;
  auVar160._12_4_ = fVar200 * auVar68._12_4_;
  auVar143._0_4_ = auVar70._0_4_ * fVar180;
  auVar143._4_4_ = auVar70._4_4_ * fVar198;
  auVar143._8_4_ = auVar70._8_4_ * fVar199;
  auVar143._12_4_ = auVar70._12_4_ * fVar200;
  auVar126._0_4_ = auVar13._0_4_ * fVar180;
  auVar126._4_4_ = auVar13._4_4_ * fVar198;
  auVar126._8_4_ = auVar13._8_4_ * fVar199;
  auVar126._12_4_ = auVar13._12_4_ * fVar200;
  auVar66 = vfmadd231ps_fma(auVar160,auVar72,auVar65);
  auVar64 = vfmadd231ps_fma(auVar143,auVar72,auVar69);
  auVar72 = vfmadd231ps_fma(auVar126,auVar234,auVar72);
  auVar63 = vfmadd231ps_fma(auVar66,auVar248,auVar67);
  auVar64 = vfmadd231ps_fma(auVar64,auVar248,auVar73);
  auVar125 = vfmadd231ps_fma(auVar72,auVar71,auVar248);
  auVar249._4_4_ = auVar181._0_4_;
  auVar249._0_4_ = auVar181._0_4_;
  auVar249._8_4_ = auVar181._0_4_;
  auVar249._12_4_ = auVar181._0_4_;
  auVar72 = vshufps_avx(auVar181,auVar181,0x55);
  auVar66 = vshufps_avx(auVar181,auVar181,0xaa);
  fVar180 = auVar66._0_4_;
  auVar250._0_4_ = fVar180 * auVar68._0_4_;
  fVar198 = auVar66._4_4_;
  auVar250._4_4_ = fVar198 * auVar68._4_4_;
  fVar199 = auVar66._8_4_;
  auVar250._8_4_ = fVar199 * auVar68._8_4_;
  fVar200 = auVar66._12_4_;
  auVar250._12_4_ = fVar200 * auVar68._12_4_;
  auVar205._0_4_ = auVar70._0_4_ * fVar180;
  auVar205._4_4_ = auVar70._4_4_ * fVar198;
  auVar205._8_4_ = auVar70._8_4_ * fVar199;
  auVar205._12_4_ = auVar70._12_4_ * fVar200;
  auVar182._0_4_ = auVar13._0_4_ * fVar180;
  auVar182._4_4_ = auVar13._4_4_ * fVar198;
  auVar182._8_4_ = auVar13._8_4_ * fVar199;
  auVar182._12_4_ = auVar13._12_4_ * fVar200;
  auVar65 = vfmadd231ps_fma(auVar250,auVar72,auVar65);
  auVar68 = vfmadd231ps_fma(auVar205,auVar72,auVar69);
  auVar69 = vfmadd231ps_fma(auVar182,auVar72,auVar234);
  auVar70 = vfmadd231ps_fma(auVar65,auVar249,auVar67);
  auVar234 = vfmadd231ps_fma(auVar68,auVar249,auVar73);
  auVar226._8_4_ = 0x7fffffff;
  auVar226._0_8_ = 0x7fffffff7fffffff;
  auVar226._12_4_ = 0x7fffffff;
  auVar13 = vfmadd231ps_fma(auVar69,auVar249,auVar71);
  auVar67 = vandps_avx(auVar63,auVar226);
  auVar222._8_4_ = 0x219392ef;
  auVar222._0_8_ = 0x219392ef219392ef;
  auVar222._12_4_ = 0x219392ef;
  uVar57 = vcmpps_avx512vl(auVar67,auVar222,1);
  bVar59 = (bool)((byte)uVar57 & 1);
  auVar66._0_4_ = (uint)bVar59 * 0x219392ef | (uint)!bVar59 * auVar63._0_4_;
  bVar59 = (bool)((byte)(uVar57 >> 1) & 1);
  auVar66._4_4_ = (uint)bVar59 * 0x219392ef | (uint)!bVar59 * auVar63._4_4_;
  bVar59 = (bool)((byte)(uVar57 >> 2) & 1);
  auVar66._8_4_ = (uint)bVar59 * 0x219392ef | (uint)!bVar59 * auVar63._8_4_;
  bVar59 = (bool)((byte)(uVar57 >> 3) & 1);
  auVar66._12_4_ = (uint)bVar59 * 0x219392ef | (uint)!bVar59 * auVar63._12_4_;
  auVar67 = vandps_avx(auVar64,auVar226);
  uVar57 = vcmpps_avx512vl(auVar67,auVar222,1);
  bVar59 = (bool)((byte)uVar57 & 1);
  auVar63._0_4_ = (uint)bVar59 * 0x219392ef | (uint)!bVar59 * auVar64._0_4_;
  bVar59 = (bool)((byte)(uVar57 >> 1) & 1);
  auVar63._4_4_ = (uint)bVar59 * 0x219392ef | (uint)!bVar59 * auVar64._4_4_;
  bVar59 = (bool)((byte)(uVar57 >> 2) & 1);
  auVar63._8_4_ = (uint)bVar59 * 0x219392ef | (uint)!bVar59 * auVar64._8_4_;
  bVar59 = (bool)((byte)(uVar57 >> 3) & 1);
  auVar63._12_4_ = (uint)bVar59 * 0x219392ef | (uint)!bVar59 * auVar64._12_4_;
  auVar67 = vandps_avx(auVar125,auVar226);
  uVar57 = vcmpps_avx512vl(auVar67,auVar222,1);
  bVar59 = (bool)((byte)uVar57 & 1);
  auVar64._0_4_ = (uint)bVar59 * 0x219392ef | (uint)!bVar59 * auVar125._0_4_;
  bVar59 = (bool)((byte)(uVar57 >> 1) & 1);
  auVar64._4_4_ = (uint)bVar59 * 0x219392ef | (uint)!bVar59 * auVar125._4_4_;
  bVar59 = (bool)((byte)(uVar57 >> 2) & 1);
  auVar64._8_4_ = (uint)bVar59 * 0x219392ef | (uint)!bVar59 * auVar125._8_4_;
  bVar59 = (bool)((byte)(uVar57 >> 3) & 1);
  auVar64._12_4_ = (uint)bVar59 * 0x219392ef | (uint)!bVar59 * auVar125._12_4_;
  auVar65 = vrcp14ps_avx512vl(auVar66);
  auVar223._8_4_ = 0x3f800000;
  auVar223._0_8_ = 0x3f8000003f800000;
  auVar223._12_4_ = 0x3f800000;
  auVar67 = vfnmadd213ps_fma(auVar66,auVar65,auVar223);
  auVar73 = vfmadd132ps_fma(auVar67,auVar65,auVar65);
  auVar65 = vrcp14ps_avx512vl(auVar63);
  auVar67 = vfnmadd213ps_fma(auVar63,auVar65,auVar223);
  auVar69 = vfmadd132ps_fma(auVar67,auVar65,auVar65);
  auVar65 = vrcp14ps_avx512vl(auVar64);
  auVar67 = vfnmadd213ps_fma(auVar64,auVar65,auVar223);
  auVar71 = vfmadd132ps_fma(auVar67,auVar65,auVar65);
  auVar67._8_8_ = 0;
  auVar67._0_8_ = *(ulong *)(prim + uVar58 * 7 + 6);
  auVar67 = vpmovsxwd_avx(auVar67);
  auVar67 = vcvtdq2ps_avx(auVar67);
  auVar67 = vsubps_avx(auVar67,auVar70);
  auVar216._0_4_ = auVar73._0_4_ * auVar67._0_4_;
  auVar216._4_4_ = auVar73._4_4_ * auVar67._4_4_;
  auVar216._8_4_ = auVar73._8_4_ * auVar67._8_4_;
  auVar216._12_4_ = auVar73._12_4_ * auVar67._12_4_;
  auVar65._8_8_ = 0;
  auVar65._0_8_ = *(ulong *)(prim + uVar58 * 9 + 6);
  auVar67 = vpmovsxwd_avx(auVar65);
  auVar67 = vcvtdq2ps_avx(auVar67);
  auVar67 = vsubps_avx(auVar67,auVar70);
  auVar66 = vpbroadcastd_avx512vl();
  auVar68._8_8_ = 0;
  auVar68._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar3 * 0x10 + 6);
  auVar65 = vpmovsxwd_avx(auVar68);
  auVar161._0_4_ = auVar73._0_4_ * auVar67._0_4_;
  auVar161._4_4_ = auVar73._4_4_ * auVar67._4_4_;
  auVar161._8_4_ = auVar73._8_4_ * auVar67._8_4_;
  auVar161._12_4_ = auVar73._12_4_ * auVar67._12_4_;
  auVar73._8_8_ = 0;
  auVar73._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar3 * 0x10 + uVar58 * -2 + 6);
  auVar67 = vpmovsxwd_avx(auVar73);
  auVar67 = vcvtdq2ps_avx(auVar67);
  auVar67 = vsubps_avx(auVar67,auVar234);
  auVar224._0_4_ = auVar69._0_4_ * auVar67._0_4_;
  auVar224._4_4_ = auVar69._4_4_ * auVar67._4_4_;
  auVar224._8_4_ = auVar69._8_4_ * auVar67._8_4_;
  auVar224._12_4_ = auVar69._12_4_ * auVar67._12_4_;
  auVar67 = vcvtdq2ps_avx(auVar65);
  auVar67 = vsubps_avx(auVar67,auVar234);
  auVar144._0_4_ = auVar69._0_4_ * auVar67._0_4_;
  auVar144._4_4_ = auVar69._4_4_ * auVar67._4_4_;
  auVar144._8_4_ = auVar69._8_4_ * auVar67._8_4_;
  auVar144._12_4_ = auVar69._12_4_ * auVar67._12_4_;
  auVar69._8_8_ = 0;
  auVar69._0_8_ = *(ulong *)(prim + uVar61 + uVar58 + 6);
  auVar67 = vpmovsxwd_avx(auVar69);
  auVar67 = vcvtdq2ps_avx(auVar67);
  auVar67 = vsubps_avx(auVar67,auVar13);
  auVar206._0_4_ = auVar71._0_4_ * auVar67._0_4_;
  auVar206._4_4_ = auVar71._4_4_ * auVar67._4_4_;
  auVar206._8_4_ = auVar71._8_4_ * auVar67._8_4_;
  auVar206._12_4_ = auVar71._12_4_ * auVar67._12_4_;
  auVar70._8_8_ = 0;
  auVar70._0_8_ = *(ulong *)(prim + uVar58 * 0x17 + 6);
  auVar67 = vpmovsxwd_avx(auVar70);
  auVar67 = vcvtdq2ps_avx(auVar67);
  auVar67 = vsubps_avx(auVar67,auVar13);
  auVar127._0_4_ = auVar71._0_4_ * auVar67._0_4_;
  auVar127._4_4_ = auVar71._4_4_ * auVar67._4_4_;
  auVar127._8_4_ = auVar71._8_4_ * auVar67._8_4_;
  auVar127._12_4_ = auVar71._12_4_ * auVar67._12_4_;
  auVar67 = vpminsd_avx(auVar216,auVar161);
  auVar65 = vpminsd_avx(auVar224,auVar144);
  auVar67 = vmaxps_avx(auVar67,auVar65);
  auVar65 = vpminsd_avx(auVar206,auVar127);
  uVar124 = *(undefined4 *)((long)&(ray->org).field_0 + 0xc);
  auVar71._4_4_ = uVar124;
  auVar71._0_4_ = uVar124;
  auVar71._8_4_ = uVar124;
  auVar71._12_4_ = uVar124;
  auVar65 = vmaxps_avx512vl(auVar65,auVar71);
  auVar67 = vmaxps_avx(auVar67,auVar65);
  auVar234._8_4_ = 0x3f7ffffa;
  auVar234._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar234._12_4_ = 0x3f7ffffa;
  local_3a0 = vmulps_avx512vl(auVar67,auVar234);
  auVar67 = vpmaxsd_avx(auVar216,auVar161);
  auVar65 = vpmaxsd_avx(auVar224,auVar144);
  auVar67 = vminps_avx(auVar67,auVar65);
  auVar65 = vpmaxsd_avx(auVar206,auVar127);
  fVar180 = ray->tfar;
  auVar13._4_4_ = fVar180;
  auVar13._0_4_ = fVar180;
  auVar13._8_4_ = fVar180;
  auVar13._12_4_ = fVar180;
  auVar65 = vminps_avx512vl(auVar65,auVar13);
  auVar67 = vminps_avx(auVar67,auVar65);
  auVar72._8_4_ = 0x3f800003;
  auVar72._0_8_ = 0x3f8000033f800003;
  auVar72._12_4_ = 0x3f800003;
  auVar67 = vmulps_avx512vl(auVar67,auVar72);
  uVar14 = vcmpps_avx512vl(local_3a0,auVar67,2);
  local_488 = vpcmpgtd_avx512vl(auVar66,_DAT_01f7fcf0);
  local_488 = ((byte)uVar14 & 0xf) & local_488;
  if ((char)local_488 == '\0') {
    return false;
  }
  local_490 = prim;
LAB_01ab8f12:
  lVar56 = 0;
  for (uVar57 = local_488; (uVar57 & 1) == 0; uVar57 = uVar57 >> 1 | 0x8000000000000000) {
    lVar56 = lVar56 + 1;
  }
  local_8e8 = (ulong)*(uint *)(prim + 2);
  pGVar4 = (context->scene->geometries).items[*(uint *)(prim + 2)].ptr;
  local_5e8 = (ulong)*(uint *)(prim + lVar56 * 4 + 6);
  uVar57 = (ulong)*(uint *)(*(long *)&pGVar4->field_0x58 +
                           pGVar4[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i * (ulong)*(uint *)(prim + lVar56 * 4 + 6));
  p_Var5 = pGVar4[1].intersectionFilterN;
  lVar56 = *(long *)&pGVar4[1].time_range.upper;
  auVar67 = *(undefined1 (*) [16])(lVar56 + (long)p_Var5 * uVar57);
  auVar65 = *(undefined1 (*) [16])(lVar56 + (uVar57 + 1) * (long)p_Var5);
  local_488 = local_488 - 1 & local_488;
  if (local_488 != 0) {
    uVar58 = local_488 - 1 & local_488;
    for (uVar61 = local_488; (uVar61 & 1) == 0; uVar61 = uVar61 >> 1 | 0x8000000000000000) {
    }
    if (uVar58 != 0) {
      for (; (uVar58 & 1) == 0; uVar58 = uVar58 >> 1 | 0x8000000000000000) {
      }
    }
  }
  auVar217._0_4_ = auVar67._0_4_ + auVar65._0_4_;
  auVar217._4_4_ = auVar67._4_4_ + auVar65._4_4_;
  auVar217._8_4_ = auVar67._8_4_ + auVar65._8_4_;
  auVar217._12_4_ = auVar67._12_4_ + auVar65._12_4_;
  aVar1 = (ray->org).field_0;
  aVar2 = (ray->dir).field_0.field_1;
  auVar19._8_4_ = 0x3f000000;
  auVar19._0_8_ = 0x3f0000003f000000;
  auVar19._12_4_ = 0x3f000000;
  auVar68 = vmulps_avx512vl(auVar217,auVar19);
  auVar68 = vsubps_avx(auVar68,(undefined1  [16])aVar1);
  auVar68 = vdpps_avx(auVar68,(undefined1  [16])aVar2,0x7f);
  auVar73 = vdpps_avx((undefined1  [16])aVar2,(undefined1  [16])aVar2,0x7f);
  auVar70 = ZEXT816(0) << 0x40;
  auVar244 = ZEXT1664(auVar70);
  auVar233._4_12_ = ZEXT812(0) << 0x20;
  auVar233._0_4_ = auVar73._0_4_;
  auVar69 = vrcp14ss_avx512f(auVar70,auVar233);
  auVar236 = ZEXT1664(auVar69);
  auVar73 = vfnmadd213ss_fma(auVar69,auVar73,ZEXT416(0x40000000));
  fVar180 = auVar68._0_4_ * auVar69._0_4_ * auVar73._0_4_;
  local_4d0 = ZEXT416((uint)fVar180);
  auVar218._4_4_ = fVar180;
  auVar218._0_4_ = fVar180;
  auVar218._8_4_ = fVar180;
  auVar218._12_4_ = fVar180;
  fStack_8b0 = fVar180;
  _local_8c0 = auVar218;
  fStack_8ac = fVar180;
  fStack_8a8 = fVar180;
  fStack_8a4 = fVar180;
  auVar68 = vfmadd231ps_fma((undefined1  [16])aVar1,(undefined1  [16])aVar2,auVar218);
  auVar68 = vblendps_avx(auVar68,auVar70,8);
  auVar67 = vsubps_avx(auVar67,auVar68);
  auVar73 = vsubps_avx(*(undefined1 (*) [16])(lVar56 + (uVar57 + 2) * (long)p_Var5),auVar68);
  local_640 = vbroadcastss_avx512vl(ZEXT416((uint)(ray->dir).field_0.m128[0]));
  auVar256 = ZEXT3264(local_640);
  local_660 = vbroadcastss_avx512vl(ZEXT416((uint)(ray->dir).field_0.m128[1]));
  auVar259 = ZEXT3264(local_660);
  local_3e0 = *(undefined4 *)((long)&(ray->dir).field_0 + 8);
  uStack_3dc = local_3e0;
  uStack_3d8 = local_3e0;
  uStack_3d4 = local_3e0;
  uStack_3d0 = local_3e0;
  uStack_3cc = local_3e0;
  uStack_3c8 = local_3e0;
  uStack_3c4 = local_3e0;
  auVar65 = vsubps_avx(auVar65,auVar68);
  auVar231 = ZEXT1664(auVar65);
  auVar68 = vsubps_avx(*(undefined1 (*) [16])(lVar56 + (uVar57 + 3) * (long)p_Var5),auVar68);
  local_6c0 = vbroadcastss_avx512vl(auVar67);
  auVar251 = ZEXT3264(local_6c0);
  auVar77._8_4_ = 1;
  auVar77._0_8_ = 0x100000001;
  auVar77._12_4_ = 1;
  auVar77._16_4_ = 1;
  auVar77._20_4_ = 1;
  auVar77._24_4_ = 1;
  auVar77._28_4_ = 1;
  local_540 = ZEXT1632(auVar67);
  local_6e0 = vpermps_avx512vl(auVar77,local_540);
  auVar252 = ZEXT3264(local_6e0);
  auVar78._8_4_ = 2;
  auVar78._0_8_ = 0x200000002;
  auVar78._12_4_ = 2;
  auVar78._16_4_ = 2;
  auVar78._20_4_ = 2;
  auVar78._24_4_ = 2;
  auVar78._28_4_ = 2;
  local_800 = vpermps_avx512vl(auVar78,local_540);
  auVar253 = ZEXT3264(local_800);
  auVar75._8_4_ = 3;
  auVar75._0_8_ = 0x300000003;
  auVar75._12_4_ = 3;
  auVar75._16_4_ = 3;
  auVar75._20_4_ = 3;
  auVar75._24_4_ = 3;
  auVar75._28_4_ = 3;
  local_700 = vpermps_avx512vl(auVar75,local_540);
  auVar254 = ZEXT3264(local_700);
  local_820 = vbroadcastss_avx512vl(auVar65);
  auVar255 = ZEXT3264(local_820);
  local_580 = ZEXT1632(auVar65);
  local_840 = vpermps_avx512vl(auVar77,local_580);
  auVar257 = ZEXT3264(local_840);
  local_720 = vpermps_avx512vl(auVar78,local_580);
  auVar258 = ZEXT3264(local_720);
  local_740 = vpermps_avx512vl(auVar75,local_580);
  auVar260 = ZEXT3264(local_740);
  local_760 = vbroadcastss_avx512vl(auVar73);
  auVar261 = ZEXT3264(local_760);
  local_560 = ZEXT1632(auVar73);
  local_780 = vpermps_avx512vl(auVar77,local_560);
  auVar262 = ZEXT3264(local_780);
  local_2a0 = vpermps_avx512vl(auVar78,local_560);
  local_1e0 = vpermps_avx2(auVar75,local_560);
  uVar124 = auVar68._0_4_;
  local_2c0._4_4_ = uVar124;
  local_2c0._0_4_ = uVar124;
  local_2c0._8_4_ = uVar124;
  local_2c0._12_4_ = uVar124;
  local_2c0._16_4_ = uVar124;
  local_2c0._20_4_ = uVar124;
  local_2c0._24_4_ = uVar124;
  local_2c0._28_4_ = uVar124;
  _local_5a0 = ZEXT1632(auVar68);
  _local_200 = vpermps_avx2(auVar77,_local_5a0);
  _local_220 = vpermps_avx2(auVar78,_local_5a0);
  local_240 = vpermps_avx2(auVar75,_local_5a0);
  auVar74 = vpermps_avx2(auVar78,ZEXT1632(CONCAT412(aVar2.field_3.w * aVar2.field_3.w,
                                                    CONCAT48(aVar2.z * aVar2.z,
                                                             CONCAT44(aVar2.y * aVar2.y,
                                                                      aVar2.x * aVar2.x)))));
  auVar74 = vfmadd231ps_avx512vl(auVar74,local_660,local_660);
  local_260 = vfmadd231ps_avx512vl(auVar74,local_640,local_640);
  auVar74._8_4_ = 0x7fffffff;
  auVar74._0_8_ = 0x7fffffff7fffffff;
  auVar74._12_4_ = 0x7fffffff;
  auVar74._16_4_ = 0x7fffffff;
  auVar74._20_4_ = 0x7fffffff;
  auVar74._24_4_ = 0x7fffffff;
  auVar74._28_4_ = 0x7fffffff;
  vandps_avx512vl(local_260,auVar74);
  local_280 = local_260;
  local_90c = 1;
  uVar57 = 0;
  bVar59 = false;
  local_390 = ZEXT816(0x3f80000000000000);
  do {
    auVar67 = vmovshdup_avx(local_390);
    auVar67 = vsubps_avx(auVar67,local_390);
    auVar128._0_4_ = auVar67._0_4_;
    fVar214 = auVar128._0_4_ * 0.04761905;
    uVar124 = local_390._0_4_;
    local_7e0._4_4_ = uVar124;
    local_7e0._0_4_ = uVar124;
    local_7e0._8_4_ = uVar124;
    local_7e0._12_4_ = uVar124;
    local_7e0._16_4_ = uVar124;
    local_7e0._20_4_ = uVar124;
    local_7e0._24_4_ = uVar124;
    local_7e0._28_4_ = uVar124;
    auVar128._4_4_ = auVar128._0_4_;
    auVar128._8_4_ = auVar128._0_4_;
    auVar128._12_4_ = auVar128._0_4_;
    local_500._16_4_ = auVar128._0_4_;
    local_500._0_16_ = auVar128;
    local_500._20_4_ = auVar128._0_4_;
    local_500._24_4_ = auVar128._0_4_;
    local_500._28_4_ = auVar128._0_4_;
    auVar67 = vfmadd231ps_fma(local_7e0,local_500,_DAT_01faff20);
    auVar74 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
    auVar74 = vsubps_avx512vl(auVar74,ZEXT1632(auVar67));
    fVar180 = auVar67._0_4_;
    fVar198 = auVar67._4_4_;
    fVar199 = auVar67._8_4_;
    fVar200 = auVar67._12_4_;
    fVar201 = auVar74._0_4_;
    fVar202 = auVar74._4_4_;
    fVar203 = auVar74._8_4_;
    fVar204 = auVar74._12_4_;
    fVar211 = auVar74._16_4_;
    fVar212 = auVar74._20_4_;
    fVar213 = auVar74._24_4_;
    auVar82._4_4_ = fVar202 * fVar202 * -fVar198;
    auVar82._0_4_ = fVar201 * fVar201 * -fVar180;
    auVar82._8_4_ = fVar203 * fVar203 * -fVar199;
    auVar82._12_4_ = fVar204 * fVar204 * -fVar200;
    auVar82._16_4_ = fVar211 * fVar211 * -0.0;
    auVar82._20_4_ = fVar212 * fVar212 * -0.0;
    auVar82._24_4_ = fVar213 * fVar213 * -0.0;
    auVar82._28_4_ = 0x80000000;
    fVar232 = fVar180 * 3.0;
    fVar238 = fVar198 * 3.0;
    fVar239 = fVar199 * 3.0;
    fVar240 = fVar200 * 3.0;
    auVar237._28_36_ = auVar236._28_36_;
    auVar237._0_28_ = ZEXT1628(CONCAT412(fVar240,CONCAT48(fVar239,CONCAT44(fVar238,fVar232))));
    fVar242 = auVar236._28_4_ + -5.0;
    auVar100._0_4_ = (fVar232 + -5.0) * fVar180 * fVar180 + 2.0;
    auVar100._4_4_ = (fVar238 + -5.0) * fVar198 * fVar198 + 2.0;
    auVar100._8_4_ = (fVar239 + -5.0) * fVar199 * fVar199 + 2.0;
    auVar100._12_4_ = (fVar240 + -5.0) * fVar200 * fVar200 + 2.0;
    auVar100._16_4_ = 0x40000000;
    auVar100._20_4_ = 0x40000000;
    auVar100._24_4_ = 0x40000000;
    auVar100._28_4_ = DAT_01faff20._28_4_ + 2.0;
    auVar236._0_4_ = fVar201 * fVar201;
    auVar236._4_4_ = fVar202 * fVar202;
    auVar236._8_4_ = fVar203 * fVar203;
    auVar236._12_4_ = fVar204 * fVar204;
    auVar236._16_4_ = fVar211 * fVar211;
    auVar236._20_4_ = fVar212 * fVar212;
    auVar236._28_36_ = auVar244._28_36_;
    auVar236._24_4_ = fVar213 * fVar213;
    auVar104._0_4_ = auVar236._0_4_ * (fVar201 * 3.0 + -5.0) + 2.0;
    auVar104._4_4_ = auVar236._4_4_ * (fVar202 * 3.0 + -5.0) + 2.0;
    auVar104._8_4_ = auVar236._8_4_ * (fVar203 * 3.0 + -5.0) + 2.0;
    auVar104._12_4_ = auVar236._12_4_ * (fVar204 * 3.0 + -5.0) + 2.0;
    auVar104._16_4_ = auVar236._16_4_ * (fVar211 * 3.0 + -5.0) + 2.0;
    auVar104._20_4_ = auVar236._20_4_ * (fVar212 * 3.0 + -5.0) + 2.0;
    auVar104._24_4_ = auVar236._24_4_ * (fVar213 * 3.0 + -5.0) + 2.0;
    auVar104._28_4_ = auVar231._28_4_ + -5.0 + 2.0;
    fVar215 = auVar74._28_4_;
    auVar83._4_4_ = fVar198 * fVar198 * -fVar202;
    auVar83._0_4_ = fVar180 * fVar180 * -fVar201;
    auVar83._8_4_ = fVar199 * fVar199 * -fVar203;
    auVar83._12_4_ = fVar200 * fVar200 * -fVar204;
    auVar83._16_4_ = -fVar211 * 0.0 * 0.0;
    auVar83._20_4_ = -fVar212 * 0.0 * 0.0;
    auVar83._24_4_ = -fVar213 * 0.0 * 0.0;
    auVar83._28_4_ = -fVar215;
    auVar75 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
    auVar74 = vmulps_avx512vl(auVar82,auVar75);
    auVar76 = vmulps_avx512vl(auVar100,auVar75);
    auVar77 = vmulps_avx512vl(auVar104,auVar75);
    auVar78 = vmulps_avx512vl(auVar83,auVar75);
    auVar79 = vmulps_avx512vl(local_2c0,auVar78);
    auVar85._4_4_ = (float)local_200._4_4_ * auVar78._4_4_;
    auVar85._0_4_ = (float)local_200._0_4_ * auVar78._0_4_;
    auVar85._8_4_ = fStack_1f8 * auVar78._8_4_;
    auVar85._12_4_ = fStack_1f4 * auVar78._12_4_;
    auVar85._16_4_ = fStack_1f0 * auVar78._16_4_;
    auVar85._20_4_ = fStack_1ec * auVar78._20_4_;
    auVar85._24_4_ = fStack_1e8 * auVar78._24_4_;
    auVar85._28_4_ = auVar104._28_4_;
    auVar86._4_4_ = (float)local_220._4_4_ * auVar78._4_4_;
    auVar86._0_4_ = (float)local_220._0_4_ * auVar78._0_4_;
    auVar86._8_4_ = fStack_218 * auVar78._8_4_;
    auVar86._12_4_ = fStack_214 * auVar78._12_4_;
    auVar86._16_4_ = fStack_210 * auVar78._16_4_;
    auVar86._20_4_ = fStack_20c * auVar78._20_4_;
    auVar86._24_4_ = fStack_208 * auVar78._24_4_;
    auVar86._28_4_ = auVar100._28_4_;
    auVar78 = vmulps_avx512vl(local_240,auVar78);
    auVar79 = vfmadd231ps_avx512vl(auVar79,auVar77,auVar261._0_32_);
    auVar80 = vfmadd231ps_avx512vl(auVar85,auVar77,auVar262._0_32_);
    auVar81 = vfmadd231ps_avx512vl(auVar86,auVar77,local_2a0);
    auVar77 = vfmadd231ps_avx512vl(auVar78,local_1e0,auVar77);
    auVar78 = vfmadd231ps_avx512vl(auVar79,auVar76,auVar255._0_32_);
    auVar79 = vfmadd231ps_avx512vl(auVar80,auVar76,auVar257._0_32_);
    auVar80 = vfmadd231ps_avx512vl(auVar81,auVar76,auVar258._0_32_);
    auVar77 = vfmadd231ps_avx512vl(auVar77,auVar260._0_32_,auVar76);
    local_520 = vfmadd231ps_avx512vl(auVar78,auVar74,auVar251._0_32_);
    local_8a0 = vfmadd231ps_avx512vl(auVar79,auVar74,auVar252._0_32_);
    local_680 = vfmadd231ps_avx512vl(auVar80,auVar74,auVar253._0_32_);
    auVar80 = vfmadd231ps_avx512vl(auVar77,auVar254._0_32_,auVar74);
    auVar87._4_4_ = (fVar202 + fVar202) * fVar198;
    auVar87._0_4_ = (fVar201 + fVar201) * fVar180;
    auVar87._8_4_ = (fVar203 + fVar203) * fVar199;
    auVar87._12_4_ = (fVar204 + fVar204) * fVar200;
    auVar87._16_4_ = (fVar211 + fVar211) * 0.0;
    auVar87._20_4_ = (fVar212 + fVar212) * 0.0;
    auVar87._24_4_ = (fVar213 + fVar213) * 0.0;
    auVar87._28_4_ = auVar76._28_4_;
    auVar74 = vsubps_avx(auVar87,auVar236._0_32_);
    auVar209._0_28_ =
         ZEXT1628(CONCAT412((fVar200 + fVar200) * (fVar240 + -5.0) + fVar240 * fVar200,
                            CONCAT48((fVar199 + fVar199) * (fVar239 + -5.0) + fVar239 * fVar199,
                                     CONCAT44((fVar198 + fVar198) * (fVar238 + -5.0) +
                                              fVar238 * fVar198,
                                              (fVar180 + fVar180) * (fVar232 + -5.0) +
                                              fVar232 * fVar180))));
    auVar209._28_4_ = fVar242 + 0.0;
    auVar79._8_4_ = 0x40000000;
    auVar79._0_8_ = 0x4000000040000000;
    auVar79._12_4_ = 0x40000000;
    auVar79._16_4_ = 0x40000000;
    auVar79._20_4_ = 0x40000000;
    auVar79._24_4_ = 0x40000000;
    auVar79._28_4_ = 0x40000000;
    auVar77 = vaddps_avx512vl(auVar237._0_32_,auVar79);
    auVar88._4_4_ = (fVar202 + fVar202) * auVar77._4_4_;
    auVar88._0_4_ = (fVar201 + fVar201) * auVar77._0_4_;
    auVar88._8_4_ = (fVar203 + fVar203) * auVar77._8_4_;
    auVar88._12_4_ = (fVar204 + fVar204) * auVar77._12_4_;
    auVar88._16_4_ = (fVar211 + fVar211) * auVar77._16_4_;
    auVar88._20_4_ = (fVar212 + fVar212) * auVar77._20_4_;
    auVar88._24_4_ = (fVar213 + fVar213) * auVar77._24_4_;
    auVar88._28_4_ = auVar77._28_4_;
    auVar92._4_4_ = fVar202 * fVar202 * 3.0;
    auVar92._0_4_ = fVar201 * fVar201 * 3.0;
    auVar92._8_4_ = fVar203 * fVar203 * 3.0;
    auVar92._12_4_ = fVar204 * fVar204 * 3.0;
    auVar92._16_4_ = fVar211 * fVar211 * 3.0;
    auVar92._20_4_ = fVar212 * fVar212 * 3.0;
    auVar92._24_4_ = fVar213 * fVar213 * 3.0;
    auVar92._28_4_ = fVar215;
    auVar77 = vsubps_avx(auVar88,auVar92);
    auVar78 = vsubps_avx(ZEXT1632(CONCAT412(fVar200 * fVar200,
                                            CONCAT48(fVar199 * fVar199,
                                                     CONCAT44(fVar198 * fVar198,fVar180 * fVar180)))
                                 ),auVar87);
    auVar79 = vmulps_avx512vl(auVar74,auVar75);
    auVar81 = vmulps_avx512vl(auVar209,auVar75);
    auVar77 = vmulps_avx512vl(auVar77,auVar75);
    auVar78 = vmulps_avx512vl(auVar78,auVar75);
    fVar180 = auVar78._0_4_;
    fVar198 = auVar78._4_4_;
    auVar93._4_4_ = local_2c0._4_4_ * fVar198;
    auVar93._0_4_ = local_2c0._0_4_ * fVar180;
    fVar199 = auVar78._8_4_;
    auVar93._8_4_ = local_2c0._8_4_ * fVar199;
    fVar200 = auVar78._12_4_;
    auVar93._12_4_ = local_2c0._12_4_ * fVar200;
    fVar201 = auVar78._16_4_;
    auVar93._16_4_ = local_2c0._16_4_ * fVar201;
    fVar202 = auVar78._20_4_;
    auVar93._20_4_ = local_2c0._20_4_ * fVar202;
    fVar203 = auVar78._24_4_;
    auVar93._24_4_ = local_2c0._24_4_ * fVar203;
    auVar93._28_4_ = fVar242;
    auVar94._4_4_ = (float)local_200._4_4_ * fVar198;
    auVar94._0_4_ = (float)local_200._0_4_ * fVar180;
    auVar94._8_4_ = fStack_1f8 * fVar199;
    auVar94._12_4_ = fStack_1f4 * fVar200;
    auVar94._16_4_ = fStack_1f0 * fVar201;
    auVar94._20_4_ = fStack_1ec * fVar202;
    auVar94._24_4_ = fStack_1e8 * fVar203;
    auVar94._28_4_ = auVar74._28_4_;
    auVar84._4_4_ = (float)local_220._4_4_ * fVar198;
    auVar84._0_4_ = (float)local_220._0_4_ * fVar180;
    auVar84._8_4_ = fStack_218 * fVar199;
    auVar84._12_4_ = fStack_214 * fVar200;
    auVar84._16_4_ = fStack_210 * fVar201;
    auVar84._20_4_ = fStack_20c * fVar202;
    auVar84._24_4_ = fStack_208 * fVar203;
    auVar84._28_4_ = auVar76._28_4_;
    auVar74 = vmulps_avx512vl(local_240,auVar78);
    auVar78 = vfmadd231ps_avx512vl(auVar93,auVar77,auVar261._0_32_);
    auVar75 = vfmadd231ps_avx512vl(auVar94,auVar77,auVar262._0_32_);
    auVar67 = vfmadd231ps_fma(auVar84,auVar77,local_2a0);
    auVar74 = vfmadd231ps_avx512vl(auVar74,local_1e0,auVar77);
    auVar77 = vfmadd231ps_avx512vl(auVar78,auVar81,auVar255._0_32_);
    auVar78 = vfmadd231ps_avx512vl(auVar75,auVar81,auVar257._0_32_);
    auVar75 = vfmadd231ps_avx512vl(ZEXT1632(auVar67),auVar81,auVar258._0_32_);
    auVar74 = vfmadd231ps_avx512vl(auVar74,auVar260._0_32_,auVar81);
    auVar77 = vfmadd231ps_avx512vl(auVar77,auVar79,auVar251._0_32_);
    auVar78 = vfmadd231ps_avx512vl(auVar78,auVar79,auVar252._0_32_);
    auVar75 = vfmadd231ps_avx512vl(auVar75,auVar79,auVar253._0_32_);
    auVar74 = vfmadd231ps_avx512vl(auVar74,auVar254._0_32_,auVar79);
    auVar101._4_4_ = auVar77._4_4_ * fVar214;
    auVar101._0_4_ = auVar77._0_4_ * fVar214;
    auVar101._8_4_ = auVar77._8_4_ * fVar214;
    auVar101._12_4_ = auVar77._12_4_ * fVar214;
    auVar101._16_4_ = auVar77._16_4_ * fVar214;
    auVar101._20_4_ = auVar77._20_4_ * fVar214;
    auVar101._24_4_ = auVar77._24_4_ * fVar214;
    auVar101._28_4_ = uStack_204;
    auVar102._4_4_ = auVar78._4_4_ * fVar214;
    auVar102._0_4_ = auVar78._0_4_ * fVar214;
    auVar102._8_4_ = auVar78._8_4_ * fVar214;
    auVar102._12_4_ = auVar78._12_4_ * fVar214;
    auVar102._16_4_ = auVar78._16_4_ * fVar214;
    auVar102._20_4_ = auVar78._20_4_ * fVar214;
    auVar102._24_4_ = auVar78._24_4_ * fVar214;
    auVar102._28_4_ = fVar215 + fVar215;
    auVar103._4_4_ = auVar75._4_4_ * fVar214;
    auVar103._0_4_ = auVar75._0_4_ * fVar214;
    auVar103._8_4_ = auVar75._8_4_ * fVar214;
    auVar103._12_4_ = auVar75._12_4_ * fVar214;
    auVar103._16_4_ = auVar75._16_4_ * fVar214;
    auVar103._20_4_ = auVar75._20_4_ * fVar214;
    auVar103._24_4_ = auVar75._24_4_ * fVar214;
    auVar103._28_4_ = auVar75._28_4_;
    fVar180 = fVar214 * auVar74._0_4_;
    fVar198 = fVar214 * auVar74._4_4_;
    auVar95._4_4_ = fVar198;
    auVar95._0_4_ = fVar180;
    fVar199 = fVar214 * auVar74._8_4_;
    auVar95._8_4_ = fVar199;
    fVar200 = fVar214 * auVar74._12_4_;
    auVar95._12_4_ = fVar200;
    fVar201 = fVar214 * auVar74._16_4_;
    auVar95._16_4_ = fVar201;
    fVar202 = fVar214 * auVar74._20_4_;
    auVar95._20_4_ = fVar202;
    fVar203 = fVar214 * auVar74._24_4_;
    auVar95._24_4_ = fVar203;
    auVar95._28_4_ = fVar214;
    auVar67 = vxorps_avx512vl(auVar258._0_16_,auVar258._0_16_);
    auVar82 = vpermt2ps_avx512vl(local_520,_DAT_01feed00,ZEXT1632(auVar67));
    auVar236 = ZEXT3264(auVar82);
    auVar83 = vpermt2ps_avx512vl(local_8a0,_DAT_01feed00,ZEXT1632(auVar67));
    auVar78 = ZEXT1632(auVar67);
    auVar84 = vpermt2ps_avx512vl(local_680,_DAT_01feed00,auVar78);
    auVar210._0_4_ = auVar80._0_4_ + fVar180;
    auVar210._4_4_ = auVar80._4_4_ + fVar198;
    auVar210._8_4_ = auVar80._8_4_ + fVar199;
    auVar210._12_4_ = auVar80._12_4_ + fVar200;
    auVar210._16_4_ = auVar80._16_4_ + fVar201;
    auVar210._20_4_ = auVar80._20_4_ + fVar202;
    auVar210._24_4_ = auVar80._24_4_ + fVar203;
    auVar210._28_4_ = auVar80._28_4_ + fVar214;
    auVar74 = vmaxps_avx(auVar80,auVar210);
    auVar77 = vminps_avx(auVar80,auVar210);
    auVar80 = vpermt2ps_avx512vl(auVar80,_DAT_01feed00,auVar78);
    auVar85 = vpermt2ps_avx512vl(auVar101,_DAT_01feed00,auVar78);
    auVar86 = vpermt2ps_avx512vl(auVar102,_DAT_01feed00,auVar78);
    auVar100 = ZEXT1632(auVar67);
    auVar87 = vpermt2ps_avx512vl(auVar103,_DAT_01feed00,auVar100);
    auVar78 = vpermt2ps_avx512vl(auVar95,_DAT_01feed00,auVar100);
    auVar78 = vsubps_avx(auVar80,auVar78);
    auVar88 = vsubps_avx512vl(auVar82,local_520);
    auVar231 = ZEXT3264(auVar88);
    auVar75 = vsubps_avx(auVar83,local_8a0);
    auVar79 = vsubps_avx(auVar84,local_680);
    auVar76 = vmulps_avx512vl(auVar75,auVar103);
    auVar76 = vfmsub231ps_avx512vl(auVar76,auVar102,auVar79);
    auVar81 = vmulps_avx512vl(auVar79,auVar101);
    auVar81 = vfmsub231ps_avx512vl(auVar81,auVar103,auVar88);
    auVar89 = vmulps_avx512vl(auVar88,auVar102);
    auVar89 = vfmsub231ps_avx512vl(auVar89,auVar101,auVar75);
    auVar89 = vmulps_avx512vl(auVar89,auVar89);
    auVar81 = vfmadd231ps_avx512vl(auVar89,auVar81,auVar81);
    auVar81 = vfmadd231ps_avx512vl(auVar81,auVar76,auVar76);
    auVar76 = vmulps_avx512vl(auVar79,auVar79);
    auVar76 = vfmadd231ps_avx512vl(auVar76,auVar75,auVar75);
    auVar90 = vfmadd231ps_avx512vl(auVar76,auVar88,auVar88);
    auVar89 = vrcp14ps_avx512vl(auVar90);
    auVar76._8_4_ = 0x3f800000;
    auVar76._0_8_ = 0x3f8000003f800000;
    auVar76._12_4_ = 0x3f800000;
    auVar76._16_4_ = 0x3f800000;
    auVar76._20_4_ = 0x3f800000;
    auVar76._24_4_ = 0x3f800000;
    auVar76._28_4_ = 0x3f800000;
    auVar76 = vfnmadd213ps_avx512vl(auVar89,auVar90,auVar76);
    auVar76 = vfmadd132ps_avx512vl(auVar76,auVar89,auVar89);
    auVar81 = vmulps_avx512vl(auVar81,auVar76);
    auVar89 = vmulps_avx512vl(auVar75,auVar87);
    auVar89 = vfmsub231ps_avx512vl(auVar89,auVar86,auVar79);
    auVar91 = vmulps_avx512vl(auVar79,auVar85);
    auVar91 = vfmsub231ps_avx512vl(auVar91,auVar87,auVar88);
    auVar92 = vmulps_avx512vl(auVar88,auVar86);
    auVar92 = vfmsub231ps_avx512vl(auVar92,auVar85,auVar75);
    auVar92 = vmulps_avx512vl(auVar92,auVar92);
    auVar91 = vfmadd231ps_avx512vl(auVar92,auVar91,auVar91);
    auVar89 = vfmadd231ps_avx512vl(auVar91,auVar89,auVar89);
    auVar76 = vmulps_avx512vl(auVar89,auVar76);
    auVar76 = vmaxps_avx512vl(auVar81,auVar76);
    auVar76 = vsqrtps_avx512vl(auVar76);
    auVar81 = vmaxps_avx512vl(auVar78,auVar80);
    auVar74 = vmaxps_avx512vl(auVar74,auVar81);
    auVar91 = vaddps_avx512vl(auVar76,auVar74);
    auVar74 = vminps_avx(auVar78,auVar80);
    auVar74 = vminps_avx(auVar77,auVar74);
    auVar74 = vsubps_avx512vl(auVar74,auVar76);
    auVar80._8_4_ = 0x3f800002;
    auVar80._0_8_ = 0x3f8000023f800002;
    auVar80._12_4_ = 0x3f800002;
    auVar80._16_4_ = 0x3f800002;
    auVar80._20_4_ = 0x3f800002;
    auVar80._24_4_ = 0x3f800002;
    auVar80._28_4_ = 0x3f800002;
    auVar77 = vmulps_avx512vl(auVar91,auVar80);
    auVar81._8_4_ = 0x3f7ffffc;
    auVar81._0_8_ = 0x3f7ffffc3f7ffffc;
    auVar81._12_4_ = 0x3f7ffffc;
    auVar81._16_4_ = 0x3f7ffffc;
    auVar81._20_4_ = 0x3f7ffffc;
    auVar81._24_4_ = 0x3f7ffffc;
    auVar81._28_4_ = 0x3f7ffffc;
    local_8e0 = vmulps_avx512vl(auVar74,auVar81);
    auVar74 = vmulps_avx512vl(auVar77,auVar77);
    auVar77 = vrsqrt14ps_avx512vl(auVar90);
    auVar89._8_4_ = 0xbf000000;
    auVar89._0_8_ = 0xbf000000bf000000;
    auVar89._12_4_ = 0xbf000000;
    auVar89._16_4_ = 0xbf000000;
    auVar89._20_4_ = 0xbf000000;
    auVar89._24_4_ = 0xbf000000;
    auVar89._28_4_ = 0xbf000000;
    auVar78 = vmulps_avx512vl(auVar90,auVar89);
    fVar180 = auVar77._0_4_;
    fVar198 = auVar77._4_4_;
    fVar199 = auVar77._8_4_;
    fVar200 = auVar77._12_4_;
    fVar201 = auVar77._16_4_;
    fVar202 = auVar77._20_4_;
    fVar203 = auVar77._24_4_;
    auVar96._4_4_ = fVar198 * fVar198 * fVar198 * auVar78._4_4_;
    auVar96._0_4_ = fVar180 * fVar180 * fVar180 * auVar78._0_4_;
    auVar96._8_4_ = fVar199 * fVar199 * fVar199 * auVar78._8_4_;
    auVar96._12_4_ = fVar200 * fVar200 * fVar200 * auVar78._12_4_;
    auVar96._16_4_ = fVar201 * fVar201 * fVar201 * auVar78._16_4_;
    auVar96._20_4_ = fVar202 * fVar202 * fVar202 * auVar78._20_4_;
    auVar96._24_4_ = fVar203 * fVar203 * fVar203 * auVar78._24_4_;
    auVar96._28_4_ = auVar91._28_4_;
    auVar90._8_4_ = 0x3fc00000;
    auVar90._0_8_ = 0x3fc000003fc00000;
    auVar90._12_4_ = 0x3fc00000;
    auVar90._16_4_ = 0x3fc00000;
    auVar90._20_4_ = 0x3fc00000;
    auVar90._24_4_ = 0x3fc00000;
    auVar90._28_4_ = 0x3fc00000;
    auVar77 = vfmadd231ps_avx512vl(auVar96,auVar77,auVar90);
    auVar78 = vmulps_avx512vl(auVar88,auVar77);
    auVar76 = vmulps_avx512vl(auVar75,auVar77);
    auVar80 = vmulps_avx512vl(auVar79,auVar77);
    auVar81 = vsubps_avx512vl(auVar100,local_520);
    auVar89 = vsubps_avx512vl(auVar100,local_8a0);
    auVar90 = vsubps_avx512vl(auVar100,local_680);
    auVar97._4_4_ = uStack_3dc;
    auVar97._0_4_ = local_3e0;
    auVar97._8_4_ = uStack_3d8;
    auVar97._12_4_ = uStack_3d4;
    auVar97._16_4_ = uStack_3d0;
    auVar97._20_4_ = uStack_3cc;
    auVar97._24_4_ = uStack_3c8;
    auVar97._28_4_ = uStack_3c4;
    auVar91 = vmulps_avx512vl(auVar97,auVar90);
    auVar91 = vfmadd231ps_avx512vl(auVar91,auVar259._0_32_,auVar89);
    auVar91 = vfmadd231ps_avx512vl(auVar91,auVar256._0_32_,auVar81);
    auVar92 = vmulps_avx512vl(auVar90,auVar90);
    auVar92 = vfmadd231ps_avx512vl(auVar92,auVar89,auVar89);
    auVar92 = vfmadd231ps_avx512vl(auVar92,auVar81,auVar81);
    auVar93 = vmulps_avx512vl(auVar97,auVar80);
    auVar93 = vfmadd231ps_avx512vl(auVar93,auVar76,auVar259._0_32_);
    auVar93 = vfmadd231ps_avx512vl(auVar93,auVar78,auVar256._0_32_);
    auVar80 = vmulps_avx512vl(auVar90,auVar80);
    auVar76 = vfmadd231ps_avx512vl(auVar80,auVar89,auVar76);
    auVar78 = vfmadd231ps_avx512vl(auVar76,auVar81,auVar78);
    auVar76 = vmulps_avx512vl(auVar93,auVar93);
    auVar80 = vsubps_avx512vl(local_260,auVar76);
    auVar94 = vmulps_avx512vl(auVar93,auVar78);
    auVar91 = vsubps_avx512vl(auVar91,auVar94);
    auVar94 = vaddps_avx512vl(auVar91,auVar91);
    auVar91 = vmulps_avx512vl(auVar78,auVar78);
    local_440 = vsubps_avx512vl(auVar92,auVar91);
    auVar74 = vsubps_avx512vl(local_440,auVar74);
    local_420 = vmulps_avx512vl(auVar94,auVar94);
    auVar91._8_4_ = 0x40800000;
    auVar91._0_8_ = 0x4080000040800000;
    auVar91._12_4_ = 0x40800000;
    auVar91._16_4_ = 0x40800000;
    auVar91._20_4_ = 0x40800000;
    auVar91._24_4_ = 0x40800000;
    auVar91._28_4_ = 0x40800000;
    _local_6a0 = vmulps_avx512vl(auVar80,auVar91);
    auVar91 = vmulps_avx512vl(_local_6a0,auVar74);
    auVar91 = vsubps_avx512vl(local_420,auVar91);
    uVar61 = vcmpps_avx512vl(auVar91,auVar100,5);
    bVar52 = (byte)uVar61;
    fVar180 = (float)local_8c0._0_4_;
    fVar198 = (float)local_8c0._4_4_;
    fVar199 = fStack_8b8;
    fVar200 = fStack_8b4;
    fVar201 = fStack_8b0;
    fVar202 = fStack_8ac;
    fVar203 = fStack_8a8;
    fVar214 = fStack_8a4;
    if (bVar52 == 0) {
LAB_01ab9c1a:
      auVar259 = ZEXT3264(local_660);
      auVar256 = ZEXT3264(local_640);
      auVar244 = ZEXT3264(auVar84);
      auVar251 = ZEXT3264(local_6c0);
      auVar252 = ZEXT3264(local_6e0);
      auVar253 = ZEXT3264(local_800);
      auVar254 = ZEXT3264(local_700);
      auVar255 = ZEXT3264(local_820);
      auVar257 = ZEXT3264(local_840);
      auVar258 = ZEXT3264(local_720);
      auVar260 = ZEXT3264(local_740);
      auVar261 = ZEXT3264(local_760);
      auVar262 = ZEXT3264(local_780);
    }
    else {
      auVar92 = _local_6a0;
      auVar91 = vsqrtps_avx512vl(auVar91);
      auVar95 = vaddps_avx512vl(auVar80,auVar80);
      local_460 = vrcp14ps_avx512vl(auVar95);
      auVar28._8_4_ = 0x3f800000;
      auVar28._0_8_ = 0x3f8000003f800000;
      auVar28._12_4_ = 0x3f800000;
      auVar28._16_4_ = 0x3f800000;
      auVar28._20_4_ = 0x3f800000;
      auVar28._24_4_ = 0x3f800000;
      auVar28._28_4_ = 0x3f800000;
      auVar96 = vfnmadd213ps_avx512vl(local_460,auVar95,auVar28);
      auVar96 = vfmadd132ps_avx512vl(auVar96,local_460,local_460);
      auVar29._8_4_ = 0x80000000;
      auVar29._0_8_ = 0x8000000080000000;
      auVar29._12_4_ = 0x80000000;
      auVar29._16_4_ = 0x80000000;
      auVar29._20_4_ = 0x80000000;
      auVar29._24_4_ = 0x80000000;
      auVar29._28_4_ = 0x80000000;
      local_480 = vxorps_avx512vl(auVar94,auVar29);
      auVar97 = vsubps_avx512vl(local_480,auVar91);
      auVar97 = vmulps_avx512vl(auVar97,auVar96);
      auVar91 = vsubps_avx512vl(auVar91,auVar94);
      local_5c0 = vmulps_avx512vl(auVar91,auVar96);
      auVar91 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
      auVar91 = vblendmps_avx512vl(auVar91,auVar97);
      auVar98._0_4_ = (uint)(bVar52 & 1) * auVar91._0_4_ | (uint)!(bool)(bVar52 & 1) * auVar96._0_4_
      ;
      bVar60 = (bool)((byte)(uVar61 >> 1) & 1);
      auVar98._4_4_ = (uint)bVar60 * auVar91._4_4_ | (uint)!bVar60 * auVar96._4_4_;
      bVar60 = (bool)((byte)(uVar61 >> 2) & 1);
      auVar98._8_4_ = (uint)bVar60 * auVar91._8_4_ | (uint)!bVar60 * auVar96._8_4_;
      bVar60 = (bool)((byte)(uVar61 >> 3) & 1);
      auVar98._12_4_ = (uint)bVar60 * auVar91._12_4_ | (uint)!bVar60 * auVar96._12_4_;
      bVar60 = (bool)((byte)(uVar61 >> 4) & 1);
      auVar98._16_4_ = (uint)bVar60 * auVar91._16_4_ | (uint)!bVar60 * auVar96._16_4_;
      bVar60 = (bool)((byte)(uVar61 >> 5) & 1);
      auVar98._20_4_ = (uint)bVar60 * auVar91._20_4_ | (uint)!bVar60 * auVar96._20_4_;
      bVar60 = (bool)((byte)(uVar61 >> 6) & 1);
      auVar98._24_4_ = (uint)bVar60 * auVar91._24_4_ | (uint)!bVar60 * auVar96._24_4_;
      bVar60 = SUB81(uVar61 >> 7,0);
      auVar98._28_4_ = (uint)bVar60 * auVar91._28_4_ | (uint)!bVar60 * auVar96._28_4_;
      auVar91 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
      auVar96 = vblendmps_avx512vl(auVar91,local_5c0);
      auVar99._0_4_ = (uint)(bVar52 & 1) * auVar96._0_4_ | (uint)!(bool)(bVar52 & 1) * auVar91._0_4_
      ;
      bVar60 = (bool)((byte)(uVar61 >> 1) & 1);
      auVar99._4_4_ = (uint)bVar60 * auVar96._4_4_ | (uint)!bVar60 * auVar91._4_4_;
      bVar60 = (bool)((byte)(uVar61 >> 2) & 1);
      auVar99._8_4_ = (uint)bVar60 * auVar96._8_4_ | (uint)!bVar60 * auVar91._8_4_;
      bVar60 = (bool)((byte)(uVar61 >> 3) & 1);
      auVar99._12_4_ = (uint)bVar60 * auVar96._12_4_ | (uint)!bVar60 * auVar91._12_4_;
      bVar60 = (bool)((byte)(uVar61 >> 4) & 1);
      auVar99._16_4_ = (uint)bVar60 * auVar96._16_4_ | (uint)!bVar60 * auVar91._16_4_;
      bVar60 = (bool)((byte)(uVar61 >> 5) & 1);
      auVar99._20_4_ = (uint)bVar60 * auVar96._20_4_ | (uint)!bVar60 * auVar91._20_4_;
      bVar60 = (bool)((byte)(uVar61 >> 6) & 1);
      auVar99._24_4_ = (uint)bVar60 * auVar96._24_4_ | (uint)!bVar60 * auVar91._24_4_;
      bVar60 = SUB81(uVar61 >> 7,0);
      auVar99._28_4_ = (uint)bVar60 * auVar96._28_4_ | (uint)!bVar60 * auVar91._28_4_;
      auVar91 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      vandps_avx512vl(auVar76,auVar91);
      auVar76 = vmaxps_avx512vl(local_280,auVar91);
      auVar30._8_4_ = 0x36000000;
      auVar30._0_8_ = 0x3600000036000000;
      auVar30._12_4_ = 0x36000000;
      auVar30._16_4_ = 0x36000000;
      auVar30._20_4_ = 0x36000000;
      auVar30._24_4_ = 0x36000000;
      auVar30._28_4_ = 0x36000000;
      auVar96 = vmulps_avx512vl(auVar76,auVar30);
      vandps_avx512vl(auVar80,auVar91);
      uVar58 = vcmpps_avx512vl(auVar96,auVar96,1);
      uVar61 = uVar61 & uVar58;
      bVar55 = (byte)uVar61;
      if (bVar55 != 0) {
        uVar58 = vcmpps_avx512vl(auVar74,_DAT_01faff00,2);
        auVar74 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
        auVar80 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
        auVar91 = vblendmps_avx512vl(auVar74,auVar80);
        bVar54 = (byte)uVar58;
        uVar62 = (uint)(bVar54 & 1) * auVar91._0_4_ | (uint)!(bool)(bVar54 & 1) * auVar96._0_4_;
        bVar60 = (bool)((byte)(uVar58 >> 1) & 1);
        uVar117 = (uint)bVar60 * auVar91._4_4_ | (uint)!bVar60 * auVar96._4_4_;
        bVar60 = (bool)((byte)(uVar58 >> 2) & 1);
        uVar118 = (uint)bVar60 * auVar91._8_4_ | (uint)!bVar60 * auVar96._8_4_;
        bVar60 = (bool)((byte)(uVar58 >> 3) & 1);
        uVar119 = (uint)bVar60 * auVar91._12_4_ | (uint)!bVar60 * auVar96._12_4_;
        bVar60 = (bool)((byte)(uVar58 >> 4) & 1);
        uVar120 = (uint)bVar60 * auVar91._16_4_ | (uint)!bVar60 * auVar96._16_4_;
        bVar60 = (bool)((byte)(uVar58 >> 5) & 1);
        uVar121 = (uint)bVar60 * auVar91._20_4_ | (uint)!bVar60 * auVar96._20_4_;
        bVar60 = (bool)((byte)(uVar58 >> 6) & 1);
        uVar122 = (uint)bVar60 * auVar91._24_4_ | (uint)!bVar60 * auVar96._24_4_;
        bVar60 = SUB81(uVar58 >> 7,0);
        uVar123 = (uint)bVar60 * auVar91._28_4_ | (uint)!bVar60 * auVar96._28_4_;
        auVar98._0_4_ = (bVar55 & 1) * uVar62 | !(bool)(bVar55 & 1) * auVar98._0_4_;
        bVar60 = (bool)((byte)(uVar61 >> 1) & 1);
        auVar98._4_4_ = bVar60 * uVar117 | !bVar60 * auVar98._4_4_;
        bVar60 = (bool)((byte)(uVar61 >> 2) & 1);
        auVar98._8_4_ = bVar60 * uVar118 | !bVar60 * auVar98._8_4_;
        bVar60 = (bool)((byte)(uVar61 >> 3) & 1);
        auVar98._12_4_ = bVar60 * uVar119 | !bVar60 * auVar98._12_4_;
        bVar60 = (bool)((byte)(uVar61 >> 4) & 1);
        auVar98._16_4_ = bVar60 * uVar120 | !bVar60 * auVar98._16_4_;
        bVar60 = (bool)((byte)(uVar61 >> 5) & 1);
        auVar98._20_4_ = bVar60 * uVar121 | !bVar60 * auVar98._20_4_;
        bVar60 = (bool)((byte)(uVar61 >> 6) & 1);
        auVar98._24_4_ = bVar60 * uVar122 | !bVar60 * auVar98._24_4_;
        bVar60 = SUB81(uVar61 >> 7,0);
        auVar98._28_4_ = bVar60 * uVar123 | !bVar60 * auVar98._28_4_;
        auVar74 = vblendmps_avx512vl(auVar80,auVar74);
        bVar60 = (bool)((byte)(uVar58 >> 1) & 1);
        bVar7 = (bool)((byte)(uVar58 >> 2) & 1);
        bVar8 = (bool)((byte)(uVar58 >> 3) & 1);
        bVar9 = (bool)((byte)(uVar58 >> 4) & 1);
        bVar10 = (bool)((byte)(uVar58 >> 5) & 1);
        bVar11 = (bool)((byte)(uVar58 >> 6) & 1);
        bVar12 = SUB81(uVar58 >> 7,0);
        auVar99._0_4_ =
             (uint)(bVar55 & 1) *
             ((uint)(bVar54 & 1) * auVar74._0_4_ | !(bool)(bVar54 & 1) * uVar62) |
             !(bool)(bVar55 & 1) * auVar99._0_4_;
        bVar6 = (bool)((byte)(uVar61 >> 1) & 1);
        auVar99._4_4_ =
             (uint)bVar6 * ((uint)bVar60 * auVar74._4_4_ | !bVar60 * uVar117) |
             !bVar6 * auVar99._4_4_;
        bVar60 = (bool)((byte)(uVar61 >> 2) & 1);
        auVar99._8_4_ =
             (uint)bVar60 * ((uint)bVar7 * auVar74._8_4_ | !bVar7 * uVar118) |
             !bVar60 * auVar99._8_4_;
        bVar60 = (bool)((byte)(uVar61 >> 3) & 1);
        auVar99._12_4_ =
             (uint)bVar60 * ((uint)bVar8 * auVar74._12_4_ | !bVar8 * uVar119) |
             !bVar60 * auVar99._12_4_;
        bVar60 = (bool)((byte)(uVar61 >> 4) & 1);
        auVar99._16_4_ =
             (uint)bVar60 * ((uint)bVar9 * auVar74._16_4_ | !bVar9 * uVar120) |
             !bVar60 * auVar99._16_4_;
        bVar60 = (bool)((byte)(uVar61 >> 5) & 1);
        auVar99._20_4_ =
             (uint)bVar60 * ((uint)bVar10 * auVar74._20_4_ | !bVar10 * uVar121) |
             !bVar60 * auVar99._20_4_;
        bVar60 = (bool)((byte)(uVar61 >> 6) & 1);
        auVar99._24_4_ =
             (uint)bVar60 * ((uint)bVar11 * auVar74._24_4_ | !bVar11 * uVar122) |
             !bVar60 * auVar99._24_4_;
        bVar60 = SUB81(uVar61 >> 7,0);
        auVar99._28_4_ =
             (uint)bVar60 * ((uint)bVar12 * auVar74._28_4_ | !bVar12 * uVar123) |
             !bVar60 * auVar99._28_4_;
        bVar52 = (~bVar55 | bVar54) & bVar52;
      }
      auVar48._4_4_ = uStack_3dc;
      auVar48._0_4_ = local_3e0;
      auVar48._8_4_ = uStack_3d8;
      auVar48._12_4_ = uStack_3d4;
      auVar48._16_4_ = uStack_3d0;
      auVar48._20_4_ = uStack_3cc;
      auVar48._24_4_ = uStack_3c8;
      auVar48._28_4_ = uStack_3c4;
      if ((bVar52 & 0x7f) == 0) goto LAB_01ab9c1a;
      auVar91 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
      auVar87 = vxorps_avx512vl(auVar87,auVar91);
      auVar85 = vxorps_avx512vl(auVar85,auVar91);
      auVar86 = vxorps_avx512vl(auVar86,auVar91);
      auVar67 = vsubss_avx512f(ZEXT416((uint)(ray->org).field_0.m128[3]),local_4d0);
      auVar74 = vbroadcastss_avx512vl(auVar67);
      auVar80 = vmaxps_avx512vl(auVar74,auVar98);
      auVar67 = vsubss_avx512f(ZEXT416((uint)ray->tfar),local_4d0);
      auVar74 = vbroadcastss_avx512vl(auVar67);
      auVar100 = vminps_avx512vl(auVar74,auVar99);
      auVar74 = vmulps_avx512vl(auVar90,auVar103);
      auVar74 = vfmadd213ps_avx512vl(auVar89,auVar102,auVar74);
      auVar67 = vfmadd213ps_fma(auVar81,auVar101,auVar74);
      auVar74 = vmulps_avx512vl(auVar48,auVar103);
      auVar259 = ZEXT3264(local_660);
      auVar74 = vfmadd231ps_avx512vl(auVar74,local_660,auVar102);
      auVar81 = vfmadd231ps_avx512vl(auVar74,local_640,auVar101);
      auVar176._8_4_ = 0x7fffffff;
      auVar176._0_8_ = 0x7fffffff7fffffff;
      auVar176._12_4_ = 0x7fffffff;
      auVar176._16_4_ = 0x7fffffff;
      auVar176._20_4_ = 0x7fffffff;
      auVar176._24_4_ = 0x7fffffff;
      auVar176._28_4_ = 0x7fffffff;
      auVar74 = vandps_avx(auVar81,auVar176);
      auVar89 = vbroadcastss_avx512vl(ZEXT416(0x219392ef));
      uVar14 = vcmpps_avx512vl(auVar74,auVar89,1);
      auVar74 = vxorps_avx512vl(ZEXT1632(auVar67),auVar91);
      auVar90 = vrcp14ps_avx512vl(auVar81);
      auVar101 = vxorps_avx512vl(auVar81,auVar91);
      auVar102 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
      auVar103 = vfnmadd213ps_avx512vl(auVar90,auVar81,auVar102);
      auVar67 = vfmadd132ps_fma(auVar103,auVar90,auVar90);
      fVar204 = auVar67._0_4_ * auVar74._0_4_;
      fVar211 = auVar67._4_4_ * auVar74._4_4_;
      auVar34._4_4_ = fVar211;
      auVar34._0_4_ = fVar204;
      fVar212 = auVar67._8_4_ * auVar74._8_4_;
      auVar34._8_4_ = fVar212;
      fVar213 = auVar67._12_4_ * auVar74._12_4_;
      auVar34._12_4_ = fVar213;
      fVar215 = auVar74._16_4_ * 0.0;
      auVar34._16_4_ = fVar215;
      fVar232 = auVar74._20_4_ * 0.0;
      auVar34._20_4_ = fVar232;
      fVar238 = auVar74._24_4_ * 0.0;
      auVar34._24_4_ = fVar238;
      auVar34._28_4_ = auVar74._28_4_;
      uVar15 = vcmpps_avx512vl(auVar81,auVar101,1);
      bVar55 = (byte)uVar14 | (byte)uVar15;
      auVar103 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
      auVar104 = vblendmps_avx512vl(auVar34,auVar103);
      auVar105._0_4_ =
           (uint)(bVar55 & 1) * auVar104._0_4_ | (uint)!(bool)(bVar55 & 1) * auVar90._0_4_;
      bVar60 = (bool)(bVar55 >> 1 & 1);
      auVar105._4_4_ = (uint)bVar60 * auVar104._4_4_ | (uint)!bVar60 * auVar90._4_4_;
      bVar60 = (bool)(bVar55 >> 2 & 1);
      auVar105._8_4_ = (uint)bVar60 * auVar104._8_4_ | (uint)!bVar60 * auVar90._8_4_;
      bVar60 = (bool)(bVar55 >> 3 & 1);
      auVar105._12_4_ = (uint)bVar60 * auVar104._12_4_ | (uint)!bVar60 * auVar90._12_4_;
      bVar60 = (bool)(bVar55 >> 4 & 1);
      auVar105._16_4_ = (uint)bVar60 * auVar104._16_4_ | (uint)!bVar60 * auVar90._16_4_;
      bVar60 = (bool)(bVar55 >> 5 & 1);
      auVar105._20_4_ = (uint)bVar60 * auVar104._20_4_ | (uint)!bVar60 * auVar90._20_4_;
      bVar60 = (bool)(bVar55 >> 6 & 1);
      auVar105._24_4_ = (uint)bVar60 * auVar104._24_4_ | (uint)!bVar60 * auVar90._24_4_;
      auVar105._28_4_ =
           (uint)(bVar55 >> 7) * auVar104._28_4_ | (uint)!(bool)(bVar55 >> 7) * auVar90._28_4_;
      auVar90 = vmaxps_avx512vl(auVar80,auVar105);
      uVar15 = vcmpps_avx512vl(auVar81,auVar101,6);
      bVar55 = (byte)uVar14 | (byte)uVar15;
      auVar101 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
      auVar106._0_4_ =
           (uint)(bVar55 & 1) * auVar101._0_4_ | (uint)!(bool)(bVar55 & 1) * (int)fVar204;
      bVar60 = (bool)(bVar55 >> 1 & 1);
      auVar106._4_4_ = (uint)bVar60 * auVar101._4_4_ | (uint)!bVar60 * (int)fVar211;
      bVar60 = (bool)(bVar55 >> 2 & 1);
      auVar106._8_4_ = (uint)bVar60 * auVar101._8_4_ | (uint)!bVar60 * (int)fVar212;
      bVar60 = (bool)(bVar55 >> 3 & 1);
      auVar106._12_4_ = (uint)bVar60 * auVar101._12_4_ | (uint)!bVar60 * (int)fVar213;
      bVar60 = (bool)(bVar55 >> 4 & 1);
      auVar106._16_4_ = (uint)bVar60 * auVar101._16_4_ | (uint)!bVar60 * (int)fVar215;
      bVar60 = (bool)(bVar55 >> 5 & 1);
      auVar106._20_4_ = (uint)bVar60 * auVar101._20_4_ | (uint)!bVar60 * (int)fVar232;
      bVar60 = (bool)(bVar55 >> 6 & 1);
      auVar106._24_4_ = (uint)bVar60 * auVar101._24_4_ | (uint)!bVar60 * (int)fVar238;
      auVar106._28_4_ =
           (uint)(bVar55 >> 7) * auVar101._28_4_ | (uint)!(bool)(bVar55 >> 7) * auVar74._28_4_;
      auVar100 = vminps_avx512vl(auVar100,auVar106);
      auVar74 = vsubps_avx(ZEXT832(0) << 0x20,auVar82);
      auVar80 = vsubps_avx(ZEXT832(0) << 0x20,auVar83);
      auVar82 = ZEXT832(0) << 0x20;
      auVar81 = vsubps_avx(auVar82,auVar84);
      auVar81 = vmulps_avx512vl(auVar81,auVar87);
      auVar80 = vfmadd231ps_avx512vl(auVar81,auVar86,auVar80);
      auVar80 = vfmadd231ps_avx512vl(auVar80,auVar85,auVar74);
      auVar74 = vmulps_avx512vl(auVar48,auVar87);
      auVar256 = ZEXT3264(local_640);
      auVar74 = vfmadd231ps_avx512vl(auVar74,local_660,auVar86);
      auVar81 = vfmadd231ps_avx512vl(auVar74,local_640,auVar85);
      auVar74 = vandps_avx(auVar81,auVar176);
      uVar14 = vcmpps_avx512vl(auVar74,auVar89,1);
      auVar74 = vxorps_avx512vl(auVar80,auVar91);
      auVar80 = vrcp14ps_avx512vl(auVar81);
      auVar84 = vxorps_avx512vl(auVar81,auVar91);
      auVar89 = vfnmadd213ps_avx512vl(auVar80,auVar81,auVar102);
      auVar67 = vfmadd132ps_fma(auVar89,auVar80,auVar80);
      fVar204 = auVar67._0_4_ * auVar74._0_4_;
      fVar211 = auVar67._4_4_ * auVar74._4_4_;
      auVar35._4_4_ = fVar211;
      auVar35._0_4_ = fVar204;
      fVar212 = auVar67._8_4_ * auVar74._8_4_;
      auVar35._8_4_ = fVar212;
      fVar213 = auVar67._12_4_ * auVar74._12_4_;
      auVar35._12_4_ = fVar213;
      fVar215 = auVar74._16_4_ * 0.0;
      auVar35._16_4_ = fVar215;
      fVar232 = auVar74._20_4_ * 0.0;
      auVar35._20_4_ = fVar232;
      fVar238 = auVar74._24_4_ * 0.0;
      auVar35._24_4_ = fVar238;
      auVar35._28_4_ = auVar74._28_4_;
      uVar15 = vcmpps_avx512vl(auVar81,auVar84,1);
      bVar55 = (byte)uVar14 | (byte)uVar15;
      auVar89 = vblendmps_avx512vl(auVar35,auVar103);
      auVar107._0_4_ =
           (uint)(bVar55 & 1) * auVar89._0_4_ | (uint)!(bool)(bVar55 & 1) * auVar80._0_4_;
      bVar60 = (bool)(bVar55 >> 1 & 1);
      auVar107._4_4_ = (uint)bVar60 * auVar89._4_4_ | (uint)!bVar60 * auVar80._4_4_;
      bVar60 = (bool)(bVar55 >> 2 & 1);
      auVar107._8_4_ = (uint)bVar60 * auVar89._8_4_ | (uint)!bVar60 * auVar80._8_4_;
      bVar60 = (bool)(bVar55 >> 3 & 1);
      auVar107._12_4_ = (uint)bVar60 * auVar89._12_4_ | (uint)!bVar60 * auVar80._12_4_;
      bVar60 = (bool)(bVar55 >> 4 & 1);
      auVar107._16_4_ = (uint)bVar60 * auVar89._16_4_ | (uint)!bVar60 * auVar80._16_4_;
      bVar60 = (bool)(bVar55 >> 5 & 1);
      auVar107._20_4_ = (uint)bVar60 * auVar89._20_4_ | (uint)!bVar60 * auVar80._20_4_;
      bVar60 = (bool)(bVar55 >> 6 & 1);
      auVar107._24_4_ = (uint)bVar60 * auVar89._24_4_ | (uint)!bVar60 * auVar80._24_4_;
      auVar107._28_4_ =
           (uint)(bVar55 >> 7) * auVar89._28_4_ | (uint)!(bool)(bVar55 >> 7) * auVar80._28_4_;
      _local_5e0 = vmaxps_avx(auVar90,auVar107);
      uVar15 = vcmpps_avx512vl(auVar81,auVar84,6);
      bVar55 = (byte)uVar14 | (byte)uVar15;
      auVar108._0_4_ =
           (uint)(bVar55 & 1) * auVar101._0_4_ | (uint)!(bool)(bVar55 & 1) * (int)fVar204;
      bVar60 = (bool)(bVar55 >> 1 & 1);
      auVar108._4_4_ = (uint)bVar60 * auVar101._4_4_ | (uint)!bVar60 * (int)fVar211;
      bVar60 = (bool)(bVar55 >> 2 & 1);
      auVar108._8_4_ = (uint)bVar60 * auVar101._8_4_ | (uint)!bVar60 * (int)fVar212;
      bVar60 = (bool)(bVar55 >> 3 & 1);
      auVar108._12_4_ = (uint)bVar60 * auVar101._12_4_ | (uint)!bVar60 * (int)fVar213;
      bVar60 = (bool)(bVar55 >> 4 & 1);
      auVar108._16_4_ = (uint)bVar60 * auVar101._16_4_ | (uint)!bVar60 * (int)fVar215;
      bVar60 = (bool)(bVar55 >> 5 & 1);
      auVar108._20_4_ = (uint)bVar60 * auVar101._20_4_ | (uint)!bVar60 * (int)fVar232;
      bVar60 = (bool)(bVar55 >> 6 & 1);
      auVar108._24_4_ = (uint)bVar60 * auVar101._24_4_ | (uint)!bVar60 * (int)fVar238;
      auVar108._28_4_ =
           (uint)(bVar55 >> 7) * auVar101._28_4_ | (uint)!(bool)(bVar55 >> 7) * auVar74._28_4_;
      local_340 = vminps_avx(auVar100,auVar108);
      auVar236 = ZEXT3264(local_340);
      auVar74 = _local_5e0;
      uVar14 = vcmpps_avx512vl(_local_5e0,local_340,2);
      bVar52 = bVar52 & 0x7f & (byte)uVar14;
      if (bVar52 == 0) goto LAB_01ab9c1a;
      auVar80 = vmaxps_avx(auVar82,local_8e0);
      auVar81 = vfmadd213ps_avx512vl(auVar97,auVar93,auVar78);
      auVar81 = vmulps_avx512vl(auVar77,auVar81);
      auVar89 = vfmadd213ps_avx512vl(local_5c0,auVar93,auVar78);
      fVar204 = auVar77._0_4_;
      fVar211 = auVar77._4_4_;
      auVar36._4_4_ = fVar211 * auVar89._4_4_;
      auVar36._0_4_ = fVar204 * auVar89._0_4_;
      fVar212 = auVar77._8_4_;
      auVar36._8_4_ = fVar212 * auVar89._8_4_;
      fVar213 = auVar77._12_4_;
      auVar36._12_4_ = fVar213 * auVar89._12_4_;
      fVar215 = auVar77._16_4_;
      auVar36._16_4_ = fVar215 * auVar89._16_4_;
      fVar232 = auVar77._20_4_;
      auVar36._20_4_ = fVar232 * auVar89._20_4_;
      fVar238 = auVar77._24_4_;
      auVar36._24_4_ = fVar238 * auVar89._24_4_;
      auVar36._28_4_ = local_5e0._28_4_;
      auVar81 = vminps_avx512vl(auVar81,auVar102);
      auVar89 = SUB6432(ZEXT864(0),0) << 0x20;
      auVar81 = vmaxps_avx(auVar81,ZEXT832(0) << 0x20);
      auVar90 = vminps_avx512vl(auVar36,auVar102);
      auVar37._4_4_ = (auVar81._4_4_ + 1.0) * 0.125;
      auVar37._0_4_ = (auVar81._0_4_ + 0.0) * 0.125;
      auVar37._8_4_ = (auVar81._8_4_ + 2.0) * 0.125;
      auVar37._12_4_ = (auVar81._12_4_ + 3.0) * 0.125;
      auVar37._16_4_ = (auVar81._16_4_ + 4.0) * 0.125;
      auVar37._20_4_ = (auVar81._20_4_ + 5.0) * 0.125;
      auVar37._24_4_ = (auVar81._24_4_ + 6.0) * 0.125;
      auVar37._28_4_ = auVar81._28_4_ + 7.0;
      local_1a0 = vfmadd213ps_avx512vl(auVar37,local_500,local_7e0);
      auVar81 = vmaxps_avx(auVar90,ZEXT832(0) << 0x20);
      auVar38._4_4_ = (auVar81._4_4_ + 1.0) * 0.125;
      auVar38._0_4_ = (auVar81._0_4_ + 0.0) * 0.125;
      auVar38._8_4_ = (auVar81._8_4_ + 2.0) * 0.125;
      auVar38._12_4_ = (auVar81._12_4_ + 3.0) * 0.125;
      auVar38._16_4_ = (auVar81._16_4_ + 4.0) * 0.125;
      auVar38._20_4_ = (auVar81._20_4_ + 5.0) * 0.125;
      auVar38._24_4_ = (auVar81._24_4_ + 6.0) * 0.125;
      auVar38._28_4_ = auVar81._28_4_ + 7.0;
      local_1c0 = vfmadd213ps_avx512vl(auVar38,local_500,local_7e0);
      auVar39._4_4_ = auVar80._4_4_ * auVar80._4_4_;
      auVar39._0_4_ = auVar80._0_4_ * auVar80._0_4_;
      auVar39._8_4_ = auVar80._8_4_ * auVar80._8_4_;
      auVar39._12_4_ = auVar80._12_4_ * auVar80._12_4_;
      auVar39._16_4_ = auVar80._16_4_ * auVar80._16_4_;
      auVar39._20_4_ = auVar80._20_4_ * auVar80._20_4_;
      auVar39._24_4_ = auVar80._24_4_ * auVar80._24_4_;
      auVar39._28_4_ = auVar80._28_4_;
      auVar81 = vsubps_avx(local_440,auVar39);
      auVar40._4_4_ = auVar81._4_4_ * (float)local_6a0._4_4_;
      auVar40._0_4_ = auVar81._0_4_ * (float)local_6a0._0_4_;
      auVar40._8_4_ = auVar81._8_4_ * fStack_698;
      auVar40._12_4_ = auVar81._12_4_ * fStack_694;
      auVar40._16_4_ = auVar81._16_4_ * fStack_690;
      auVar40._20_4_ = auVar81._20_4_ * fStack_68c;
      auVar40._24_4_ = auVar81._24_4_ * fStack_688;
      auVar40._28_4_ = auVar80._28_4_;
      auVar80 = vsubps_avx(local_420,auVar40);
      uVar61 = vcmpps_avx512vl(auVar80,ZEXT832(0) << 0x20,5);
      auVar254 = ZEXT3264(local_700);
      auVar258 = ZEXT3264(local_720);
      auVar260 = ZEXT3264(local_740);
      auVar261 = ZEXT3264(local_760);
      auVar262 = ZEXT3264(local_780);
      if ((byte)uVar61 == 0) {
        uVar61 = 0;
        auVar77 = ZEXT1232(ZEXT812(0)) << 0x20;
        auVar244 = ZEXT864(0) << 0x20;
        auVar80 = SUB6432(ZEXT864(0),0) << 0x20;
        auVar90 = SUB6432(ZEXT864(0),0) << 0x20;
        auVar241 = SUB6428(ZEXT864(0),0) << 0x20;
        auVar109._8_4_ = 0x7f800000;
        auVar109._0_8_ = 0x7f8000007f800000;
        auVar109._12_4_ = 0x7f800000;
        auVar109._16_4_ = 0x7f800000;
        auVar109._20_4_ = 0x7f800000;
        auVar109._24_4_ = 0x7f800000;
        auVar109._28_4_ = 0x7f800000;
        auVar110._8_4_ = 0xff800000;
        auVar110._0_8_ = 0xff800000ff800000;
        auVar110._12_4_ = 0xff800000;
        auVar110._16_4_ = 0xff800000;
        auVar110._20_4_ = 0xff800000;
        auVar110._24_4_ = 0xff800000;
        auVar110._28_4_ = 0xff800000;
      }
      else {
        auVar65 = vxorps_avx512vl(auVar128,auVar128);
        uVar58 = vcmpps_avx512vl(auVar80,auVar82,5);
        auVar80 = vsqrtps_avx(auVar80);
        auVar89 = vfnmadd213ps_avx512vl(auVar95,local_460,auVar102);
        auVar91 = vfmadd132ps_avx512vl(auVar89,local_460,local_460);
        auVar89 = vsubps_avx(local_480,auVar80);
        auVar82 = vmulps_avx512vl(auVar89,auVar91);
        auVar80 = vsubps_avx512vl(auVar80,auVar94);
        auVar91 = vmulps_avx512vl(auVar80,auVar91);
        auVar80 = vfmadd213ps_avx512vl(auVar93,auVar82,auVar78);
        auVar41._4_4_ = fVar211 * auVar80._4_4_;
        auVar41._0_4_ = fVar204 * auVar80._0_4_;
        auVar41._8_4_ = fVar212 * auVar80._8_4_;
        auVar41._12_4_ = fVar213 * auVar80._12_4_;
        auVar41._16_4_ = fVar215 * auVar80._16_4_;
        auVar41._20_4_ = fVar232 * auVar80._20_4_;
        auVar41._24_4_ = fVar238 * auVar80._24_4_;
        auVar41._28_4_ = auVar90._28_4_;
        auVar80 = vmulps_avx512vl(local_640,auVar82);
        auVar89 = vmulps_avx512vl(local_660,auVar82);
        auVar49._4_4_ = uStack_3dc;
        auVar49._0_4_ = local_3e0;
        auVar49._8_4_ = uStack_3d8;
        auVar49._12_4_ = uStack_3d4;
        auVar49._16_4_ = uStack_3d0;
        auVar49._20_4_ = uStack_3cc;
        auVar49._24_4_ = uStack_3c8;
        auVar49._28_4_ = uStack_3c4;
        auVar83 = vmulps_avx512vl(auVar49,auVar82);
        auVar90 = vfmadd213ps_avx512vl(auVar88,auVar41,local_520);
        auVar80 = vsubps_avx512vl(auVar80,auVar90);
        auVar90 = vfmadd213ps_avx512vl(auVar75,auVar41,local_8a0);
        auVar90 = vsubps_avx512vl(auVar89,auVar90);
        auVar67 = vfmadd213ps_fma(auVar41,auVar79,local_680);
        auVar89 = vsubps_avx(auVar83,ZEXT1632(auVar67));
        auVar241 = auVar89._0_28_;
        auVar78 = vfmadd213ps_avx512vl(auVar93,auVar91,auVar78);
        auVar42._4_4_ = fVar211 * auVar78._4_4_;
        auVar42._0_4_ = fVar204 * auVar78._0_4_;
        auVar42._8_4_ = fVar212 * auVar78._8_4_;
        auVar42._12_4_ = fVar213 * auVar78._12_4_;
        auVar42._16_4_ = fVar215 * auVar78._16_4_;
        auVar42._20_4_ = fVar232 * auVar78._20_4_;
        auVar42._24_4_ = fVar238 * auVar78._24_4_;
        auVar42._28_4_ = auVar77._28_4_;
        auVar77 = vmulps_avx512vl(local_640,auVar91);
        auVar78 = vmulps_avx512vl(local_660,auVar91);
        auVar83 = vmulps_avx512vl(auVar49,auVar91);
        auVar67 = vfmadd213ps_fma(auVar88,auVar42,local_520);
        auVar89 = vsubps_avx(auVar77,ZEXT1632(auVar67));
        auVar67 = vfmadd213ps_fma(auVar75,auVar42,local_8a0);
        auVar77 = vsubps_avx(auVar78,ZEXT1632(auVar67));
        auVar67 = vfmadd213ps_fma(auVar79,auVar42,local_680);
        auVar78 = vsubps_avx512vl(auVar83,ZEXT1632(auVar67));
        auVar244 = ZEXT3264(auVar78);
        auVar137._8_4_ = 0x7f800000;
        auVar137._0_8_ = 0x7f8000007f800000;
        auVar137._12_4_ = 0x7f800000;
        auVar137._16_4_ = 0x7f800000;
        auVar137._20_4_ = 0x7f800000;
        auVar137._24_4_ = 0x7f800000;
        auVar137._28_4_ = 0x7f800000;
        auVar78 = vblendmps_avx512vl(auVar137,auVar82);
        bVar60 = (bool)((byte)uVar58 & 1);
        auVar109._0_4_ = (uint)bVar60 * auVar78._0_4_ | (uint)!bVar60 * 0x7f800000;
        bVar60 = (bool)((byte)(uVar58 >> 1) & 1);
        auVar109._4_4_ = (uint)bVar60 * auVar78._4_4_ | (uint)!bVar60 * 0x7f800000;
        bVar60 = (bool)((byte)(uVar58 >> 2) & 1);
        auVar109._8_4_ = (uint)bVar60 * auVar78._8_4_ | (uint)!bVar60 * 0x7f800000;
        bVar60 = (bool)((byte)(uVar58 >> 3) & 1);
        auVar109._12_4_ = (uint)bVar60 * auVar78._12_4_ | (uint)!bVar60 * 0x7f800000;
        bVar60 = (bool)((byte)(uVar58 >> 4) & 1);
        auVar109._16_4_ = (uint)bVar60 * auVar78._16_4_ | (uint)!bVar60 * 0x7f800000;
        bVar60 = (bool)((byte)(uVar58 >> 5) & 1);
        auVar109._20_4_ = (uint)bVar60 * auVar78._20_4_ | (uint)!bVar60 * 0x7f800000;
        bVar60 = (bool)((byte)(uVar58 >> 6) & 1);
        auVar109._24_4_ = (uint)bVar60 * auVar78._24_4_ | (uint)!bVar60 * 0x7f800000;
        bVar60 = SUB81(uVar58 >> 7,0);
        auVar109._28_4_ = (uint)bVar60 * auVar78._28_4_ | (uint)!bVar60 * 0x7f800000;
        auVar177._8_4_ = 0xff800000;
        auVar177._0_8_ = 0xff800000ff800000;
        auVar177._12_4_ = 0xff800000;
        auVar177._16_4_ = 0xff800000;
        auVar177._20_4_ = 0xff800000;
        auVar177._24_4_ = 0xff800000;
        auVar177._28_4_ = 0xff800000;
        auVar78 = vblendmps_avx512vl(auVar177,auVar91);
        bVar60 = (bool)((byte)uVar58 & 1);
        auVar110._0_4_ = (uint)bVar60 * auVar78._0_4_ | (uint)!bVar60 * -0x800000;
        bVar60 = (bool)((byte)(uVar58 >> 1) & 1);
        auVar110._4_4_ = (uint)bVar60 * auVar78._4_4_ | (uint)!bVar60 * -0x800000;
        bVar60 = (bool)((byte)(uVar58 >> 2) & 1);
        auVar110._8_4_ = (uint)bVar60 * auVar78._8_4_ | (uint)!bVar60 * -0x800000;
        bVar60 = (bool)((byte)(uVar58 >> 3) & 1);
        auVar110._12_4_ = (uint)bVar60 * auVar78._12_4_ | (uint)!bVar60 * -0x800000;
        bVar60 = (bool)((byte)(uVar58 >> 4) & 1);
        auVar110._16_4_ = (uint)bVar60 * auVar78._16_4_ | (uint)!bVar60 * -0x800000;
        bVar60 = (bool)((byte)(uVar58 >> 5) & 1);
        auVar110._20_4_ = (uint)bVar60 * auVar78._20_4_ | (uint)!bVar60 * -0x800000;
        bVar60 = (bool)((byte)(uVar58 >> 6) & 1);
        auVar110._24_4_ = (uint)bVar60 * auVar78._24_4_ | (uint)!bVar60 * -0x800000;
        bVar60 = SUB81(uVar58 >> 7,0);
        auVar110._28_4_ = (uint)bVar60 * auVar78._28_4_ | (uint)!bVar60 * -0x800000;
        auVar31._8_4_ = 0x36000000;
        auVar31._0_8_ = 0x3600000036000000;
        auVar31._12_4_ = 0x36000000;
        auVar31._16_4_ = 0x36000000;
        auVar31._20_4_ = 0x36000000;
        auVar31._24_4_ = 0x36000000;
        auVar31._28_4_ = 0x36000000;
        auVar78 = vmulps_avx512vl(auVar76,auVar31);
        uVar16 = vcmpps_avx512vl(auVar96,auVar78,1);
        uVar58 = uVar58 & uVar16;
        bVar55 = (byte)uVar58;
        if (bVar55 != 0) {
          uVar16 = vcmpps_avx512vl(auVar81,ZEXT1632(auVar65),2);
          auVar229._8_4_ = 0x7f800000;
          auVar229._0_8_ = 0x7f8000007f800000;
          auVar229._12_4_ = 0x7f800000;
          auVar229._16_4_ = 0x7f800000;
          auVar229._20_4_ = 0x7f800000;
          auVar229._24_4_ = 0x7f800000;
          auVar229._28_4_ = 0x7f800000;
          auVar245._8_4_ = 0xff800000;
          auVar245._0_8_ = 0xff800000ff800000;
          auVar245._12_4_ = 0xff800000;
          auVar245._16_4_ = 0xff800000;
          auVar245._20_4_ = 0xff800000;
          auVar245._24_4_ = 0xff800000;
          auVar245._28_4_ = 0xff800000;
          auVar75 = vblendmps_avx512vl(auVar229,auVar245);
          bVar54 = (byte)uVar16;
          uVar62 = (uint)(bVar54 & 1) * auVar75._0_4_ | (uint)!(bool)(bVar54 & 1) * auVar78._0_4_;
          bVar60 = (bool)((byte)(uVar16 >> 1) & 1);
          uVar117 = (uint)bVar60 * auVar75._4_4_ | (uint)!bVar60 * auVar78._4_4_;
          bVar60 = (bool)((byte)(uVar16 >> 2) & 1);
          uVar118 = (uint)bVar60 * auVar75._8_4_ | (uint)!bVar60 * auVar78._8_4_;
          bVar60 = (bool)((byte)(uVar16 >> 3) & 1);
          uVar119 = (uint)bVar60 * auVar75._12_4_ | (uint)!bVar60 * auVar78._12_4_;
          bVar60 = (bool)((byte)(uVar16 >> 4) & 1);
          uVar120 = (uint)bVar60 * auVar75._16_4_ | (uint)!bVar60 * auVar78._16_4_;
          bVar60 = (bool)((byte)(uVar16 >> 5) & 1);
          uVar121 = (uint)bVar60 * auVar75._20_4_ | (uint)!bVar60 * auVar78._20_4_;
          bVar60 = (bool)((byte)(uVar16 >> 6) & 1);
          uVar122 = (uint)bVar60 * auVar75._24_4_ | (uint)!bVar60 * auVar78._24_4_;
          bVar60 = SUB81(uVar16 >> 7,0);
          uVar123 = (uint)bVar60 * auVar75._28_4_ | (uint)!bVar60 * auVar78._28_4_;
          auVar109._0_4_ = (bVar55 & 1) * uVar62 | !(bool)(bVar55 & 1) * auVar109._0_4_;
          bVar60 = (bool)((byte)(uVar58 >> 1) & 1);
          auVar109._4_4_ = bVar60 * uVar117 | !bVar60 * auVar109._4_4_;
          bVar60 = (bool)((byte)(uVar58 >> 2) & 1);
          auVar109._8_4_ = bVar60 * uVar118 | !bVar60 * auVar109._8_4_;
          bVar60 = (bool)((byte)(uVar58 >> 3) & 1);
          auVar109._12_4_ = bVar60 * uVar119 | !bVar60 * auVar109._12_4_;
          bVar60 = (bool)((byte)(uVar58 >> 4) & 1);
          auVar109._16_4_ = bVar60 * uVar120 | !bVar60 * auVar109._16_4_;
          bVar60 = (bool)((byte)(uVar58 >> 5) & 1);
          auVar109._20_4_ = bVar60 * uVar121 | !bVar60 * auVar109._20_4_;
          bVar60 = (bool)((byte)(uVar58 >> 6) & 1);
          auVar109._24_4_ = bVar60 * uVar122 | !bVar60 * auVar109._24_4_;
          bVar60 = SUB81(uVar58 >> 7,0);
          auVar109._28_4_ = bVar60 * uVar123 | !bVar60 * auVar109._28_4_;
          auVar78 = vblendmps_avx512vl(auVar245,auVar229);
          bVar60 = (bool)((byte)(uVar16 >> 1) & 1);
          bVar7 = (bool)((byte)(uVar16 >> 2) & 1);
          bVar8 = (bool)((byte)(uVar16 >> 3) & 1);
          bVar9 = (bool)((byte)(uVar16 >> 4) & 1);
          bVar10 = (bool)((byte)(uVar16 >> 5) & 1);
          bVar11 = (bool)((byte)(uVar16 >> 6) & 1);
          bVar12 = SUB81(uVar16 >> 7,0);
          auVar110._0_4_ =
               (uint)(bVar55 & 1) *
               ((uint)(bVar54 & 1) * auVar78._0_4_ | !(bool)(bVar54 & 1) * uVar62) |
               !(bool)(bVar55 & 1) * auVar110._0_4_;
          bVar6 = (bool)((byte)(uVar58 >> 1) & 1);
          auVar110._4_4_ =
               (uint)bVar6 * ((uint)bVar60 * auVar78._4_4_ | !bVar60 * uVar117) |
               !bVar6 * auVar110._4_4_;
          bVar60 = (bool)((byte)(uVar58 >> 2) & 1);
          auVar110._8_4_ =
               (uint)bVar60 * ((uint)bVar7 * auVar78._8_4_ | !bVar7 * uVar118) |
               !bVar60 * auVar110._8_4_;
          bVar60 = (bool)((byte)(uVar58 >> 3) & 1);
          auVar110._12_4_ =
               (uint)bVar60 * ((uint)bVar8 * auVar78._12_4_ | !bVar8 * uVar119) |
               !bVar60 * auVar110._12_4_;
          bVar60 = (bool)((byte)(uVar58 >> 4) & 1);
          auVar110._16_4_ =
               (uint)bVar60 * ((uint)bVar9 * auVar78._16_4_ | !bVar9 * uVar120) |
               !bVar60 * auVar110._16_4_;
          bVar60 = (bool)((byte)(uVar58 >> 5) & 1);
          auVar110._20_4_ =
               (uint)bVar60 * ((uint)bVar10 * auVar78._20_4_ | !bVar10 * uVar121) |
               !bVar60 * auVar110._20_4_;
          bVar60 = (bool)((byte)(uVar58 >> 6) & 1);
          auVar110._24_4_ =
               (uint)bVar60 * ((uint)bVar11 * auVar78._24_4_ | !bVar11 * uVar122) |
               !bVar60 * auVar110._24_4_;
          bVar60 = SUB81(uVar58 >> 7,0);
          auVar110._28_4_ =
               (uint)bVar60 * ((uint)bVar12 * auVar78._28_4_ | !bVar12 * uVar123) |
               !bVar60 * auVar110._28_4_;
          uVar61 = (ulong)(byte)((~bVar55 | bVar54) & (byte)uVar61);
        }
      }
      auVar253 = ZEXT3264(local_800);
      auVar255 = ZEXT3264(local_820);
      auVar257 = ZEXT3264(local_840);
      uVar124 = *(undefined4 *)&(ray->dir).field_0;
      auVar225._4_4_ = uVar124;
      auVar225._0_4_ = uVar124;
      auVar225._8_4_ = uVar124;
      auVar225._12_4_ = uVar124;
      auVar225._16_4_ = uVar124;
      auVar225._20_4_ = uVar124;
      auVar225._24_4_ = uVar124;
      auVar225._28_4_ = uVar124;
      uVar124 = *(undefined4 *)((long)&(ray->dir).field_0 + 4);
      auVar230._4_4_ = uVar124;
      auVar230._0_4_ = uVar124;
      auVar230._8_4_ = uVar124;
      auVar230._12_4_ = uVar124;
      auVar230._16_4_ = uVar124;
      auVar230._20_4_ = uVar124;
      auVar230._24_4_ = uVar124;
      auVar230._28_4_ = uVar124;
      auVar231 = ZEXT3264(auVar230);
      fVar204 = (ray->dir).field_0.m128[2];
      auVar251._0_4_ = fVar204 * auVar244._0_4_;
      auVar251._4_4_ = fVar204 * auVar244._4_4_;
      auVar251._8_4_ = fVar204 * auVar244._8_4_;
      auVar251._12_4_ = fVar204 * auVar244._12_4_;
      auVar251._16_4_ = fVar204 * auVar244._16_4_;
      auVar251._20_4_ = fVar204 * auVar244._20_4_;
      auVar251._28_36_ = auVar244._28_36_;
      auVar251._24_4_ = fVar204 * auVar244._24_4_;
      auVar67 = vfmadd231ps_fma(auVar251._0_32_,auVar230,auVar77);
      auVar67 = vfmadd231ps_fma(ZEXT1632(auVar67),auVar225,auVar89);
      auVar243._8_4_ = 0x7fffffff;
      auVar243._0_8_ = 0x7fffffff7fffffff;
      auVar243._12_4_ = 0x7fffffff;
      auVar243._16_4_ = 0x7fffffff;
      auVar243._20_4_ = 0x7fffffff;
      auVar243._24_4_ = 0x7fffffff;
      auVar243._28_4_ = 0x7fffffff;
      auVar244 = ZEXT3264(auVar243);
      auVar77 = vandps_avx(auVar243,ZEXT1632(auVar67));
      _local_320 = _local_5e0;
      auVar221._8_4_ = 0x3e99999a;
      auVar221._0_8_ = 0x3e99999a3e99999a;
      auVar221._12_4_ = 0x3e99999a;
      auVar221._16_4_ = 0x3e99999a;
      auVar221._20_4_ = 0x3e99999a;
      auVar221._24_4_ = 0x3e99999a;
      auVar221._28_4_ = 0x3e99999a;
      uVar14 = vcmpps_avx512vl(auVar77,auVar221,1);
      local_8ea = (short)uVar14;
      local_400 = vmaxps_avx(_local_5e0,auVar110);
      local_360 = local_400;
      auVar77 = vminps_avx(local_340,auVar109);
      uVar14 = vcmpps_avx512vl(_local_5e0,auVar77,2);
      bVar55 = (byte)uVar14 & bVar52;
      uVar15 = vcmpps_avx512vl(local_400,local_340,2);
      auVar251 = ZEXT3264(local_6c0);
      auVar252 = ZEXT3264(local_6e0);
      if ((bVar52 & ((byte)uVar15 | (byte)uVar14)) != 0) {
        auVar43._4_4_ = auVar241._4_4_ * fVar204;
        auVar43._0_4_ = auVar241._0_4_ * fVar204;
        auVar43._8_4_ = auVar241._8_4_ * fVar204;
        auVar43._12_4_ = auVar241._12_4_ * fVar204;
        auVar43._16_4_ = auVar241._16_4_ * fVar204;
        auVar43._20_4_ = auVar241._20_4_ * fVar204;
        auVar43._24_4_ = auVar241._24_4_ * fVar204;
        auVar43._28_4_ = auVar77._28_4_;
        auVar67 = vfmadd213ps_fma(auVar90,auVar230,auVar43);
        auVar67 = vfmadd213ps_fma(auVar80,auVar225,ZEXT1632(auVar67));
        auVar77 = vandps_avx(auVar243,ZEXT1632(auVar67));
        uVar14 = vcmpps_avx512vl(auVar77,auVar221,1);
        local_848 = (int)CONCAT71((int7)(uVar61 >> 8),~(byte)uVar61);
        bVar54 = (byte)uVar14 | ~(byte)uVar61;
        auVar139._8_4_ = 2;
        auVar139._0_8_ = 0x200000002;
        auVar139._12_4_ = 2;
        auVar139._16_4_ = 2;
        auVar139._20_4_ = 2;
        auVar139._24_4_ = 2;
        auVar139._28_4_ = 2;
        auVar32._8_4_ = 3;
        auVar32._0_8_ = 0x300000003;
        auVar32._12_4_ = 3;
        auVar32._16_4_ = 3;
        auVar32._20_4_ = 3;
        auVar32._24_4_ = 3;
        auVar32._28_4_ = 3;
        auVar77 = vpblendmd_avx512vl(auVar139,auVar32);
        local_2e0._0_4_ = (uint)(bVar54 & 1) * auVar77._0_4_ | (uint)!(bool)(bVar54 & 1) * 2;
        bVar60 = (bool)(bVar54 >> 1 & 1);
        local_2e0._4_4_ = (uint)bVar60 * auVar77._4_4_ | (uint)!bVar60 * 2;
        bVar60 = (bool)(bVar54 >> 2 & 1);
        local_2e0._8_4_ = (uint)bVar60 * auVar77._8_4_ | (uint)!bVar60 * 2;
        bVar60 = (bool)(bVar54 >> 3 & 1);
        local_2e0._12_4_ = (uint)bVar60 * auVar77._12_4_ | (uint)!bVar60 * 2;
        bVar60 = (bool)(bVar54 >> 4 & 1);
        local_2e0._16_4_ = (uint)bVar60 * auVar77._16_4_ | (uint)!bVar60 * 2;
        bVar60 = (bool)(bVar54 >> 5 & 1);
        local_2e0._20_4_ = (uint)bVar60 * auVar77._20_4_ | (uint)!bVar60 * 2;
        bVar60 = (bool)(bVar54 >> 6 & 1);
        local_2e0._24_4_ = (uint)bVar60 * auVar77._24_4_ | (uint)!bVar60 * 2;
        local_2e0._28_4_ = (uint)(bVar54 >> 7) * auVar77._28_4_ | (uint)!(bool)(bVar54 >> 7) * 2;
        local_380 = vpbroadcastd_avx512vl();
        uVar14 = vpcmpd_avx512vl(local_380,local_2e0,5);
        local_844 = (uint)bVar55;
        bVar55 = (byte)uVar14 & bVar55;
        _local_6a0 = auVar92;
        if (bVar55 == 0) {
          fVar204 = ray->tfar;
          auVar141._4_4_ = fVar204;
          auVar141._0_4_ = fVar204;
          auVar141._8_4_ = fVar204;
          auVar141._12_4_ = fVar204;
          auVar141._16_4_ = fVar204;
          auVar141._20_4_ = fVar204;
          auVar141._24_4_ = fVar204;
          auVar141._28_4_ = fVar204;
        }
        else {
          auVar65 = vminps_avx(local_540._0_16_,local_580._0_16_);
          auVar67 = vmaxps_avx(local_540._0_16_,local_580._0_16_);
          auVar68 = vminps_avx(local_560._0_16_,local_5a0._0_16_);
          auVar73 = vminps_avx(auVar65,auVar68);
          auVar65 = vmaxps_avx(local_560._0_16_,local_5a0._0_16_);
          auVar68 = vmaxps_avx(auVar67,auVar65);
          auVar162._8_4_ = 0x7fffffff;
          auVar162._0_8_ = 0x7fffffff7fffffff;
          auVar162._12_4_ = 0x7fffffff;
          auVar67 = vandps_avx(auVar73,auVar162);
          auVar65 = vandps_avx(auVar68,auVar162);
          auVar67 = vmaxps_avx(auVar67,auVar65);
          auVar65 = vmovshdup_avx(auVar67);
          auVar65 = vmaxss_avx(auVar65,auVar67);
          auVar67 = vshufpd_avx(auVar67,auVar67,1);
          auVar67 = vmaxss_avx(auVar67,auVar65);
          fVar204 = auVar67._0_4_ * 1.9073486e-06;
          local_4c0 = vshufps_avx(auVar68,auVar68,0xff);
          local_3c0 = (float)local_5e0._0_4_ + (float)local_8c0._0_4_;
          fStack_3bc = (float)local_5e0._4_4_ + (float)local_8c0._4_4_;
          fStack_3b8 = fStack_5d8 + fStack_8b8;
          fStack_3b4 = fStack_5d4 + fStack_8b4;
          fStack_3b0 = fStack_5d0 + fStack_8b0;
          fStack_3ac = fStack_5cc + fStack_8ac;
          fStack_3a8 = fStack_5c8 + fStack_8a8;
          fStack_3a4 = local_5e0._28_4_ + fStack_8a4;
          _local_5e0 = auVar74;
          do {
            auVar78 = local_8e0;
            auVar140._8_4_ = 0x7f800000;
            auVar140._0_8_ = 0x7f8000007f800000;
            auVar140._12_4_ = 0x7f800000;
            auVar140._16_4_ = 0x7f800000;
            auVar140._20_4_ = 0x7f800000;
            auVar140._24_4_ = 0x7f800000;
            auVar140._28_4_ = 0x7f800000;
            auVar74 = vblendmps_avx512vl(auVar140,_local_5e0);
            auVar112._0_4_ =
                 (uint)(bVar55 & 1) * auVar74._0_4_ | (uint)!(bool)(bVar55 & 1) * 0x7f800000;
            bVar60 = (bool)(bVar55 >> 1 & 1);
            auVar112._4_4_ = (uint)bVar60 * auVar74._4_4_ | (uint)!bVar60 * 0x7f800000;
            bVar60 = (bool)(bVar55 >> 2 & 1);
            auVar112._8_4_ = (uint)bVar60 * auVar74._8_4_ | (uint)!bVar60 * 0x7f800000;
            bVar60 = (bool)(bVar55 >> 3 & 1);
            auVar112._12_4_ = (uint)bVar60 * auVar74._12_4_ | (uint)!bVar60 * 0x7f800000;
            bVar60 = (bool)(bVar55 >> 4 & 1);
            auVar112._16_4_ = (uint)bVar60 * auVar74._16_4_ | (uint)!bVar60 * 0x7f800000;
            bVar60 = (bool)(bVar55 >> 5 & 1);
            auVar112._20_4_ = (uint)bVar60 * auVar74._20_4_ | (uint)!bVar60 * 0x7f800000;
            bVar60 = (bool)(bVar55 >> 6 & 1);
            auVar112._24_4_ = (uint)bVar60 * auVar74._24_4_ | (uint)!bVar60 * 0x7f800000;
            auVar112._28_4_ =
                 (uint)(bVar55 >> 7) * auVar74._28_4_ | (uint)!(bool)(bVar55 >> 7) * 0x7f800000;
            auVar74 = vshufps_avx(auVar112,auVar112,0xb1);
            auVar74 = vminps_avx(auVar112,auVar74);
            auVar77 = vshufpd_avx(auVar74,auVar74,5);
            auVar74 = vminps_avx(auVar74,auVar77);
            auVar77 = vpermpd_avx2(auVar74,0x4e);
            auVar74 = vminps_avx(auVar74,auVar77);
            uVar14 = vcmpps_avx512vl(auVar112,auVar74,0);
            bVar53 = (byte)uVar14 & bVar55;
            bVar54 = bVar55;
            if (bVar53 != 0) {
              bVar54 = bVar53;
            }
            iVar18 = 0;
            for (uVar62 = (uint)bVar54; (uVar62 & 1) == 0; uVar62 = uVar62 >> 1 | 0x80000000) {
              iVar18 = iVar18 + 1;
            }
            aVar1 = (ray->dir).field_0;
            local_500._0_16_ = (undefined1  [16])aVar1;
            auVar67 = vdpps_avx((undefined1  [16])aVar1,(undefined1  [16])aVar1,0x7f);
            if (auVar67._0_4_ < 0.0) {
              local_8e0[1] = 0;
              local_8e0[0] = bVar55;
              local_8e0._2_30_ = auVar78._2_30_;
              local_8a0._0_16_ = ZEXT416(*(uint *)(local_1a0 + (uint)(iVar18 << 2)));
              local_7e0._0_16_ = ZEXT416(*(uint *)(local_320 + (uint)(iVar18 << 2)));
              fVar211 = sqrtf(auVar67._0_4_);
              bVar55 = local_8e0[0];
              auVar67 = local_7e0._0_16_;
              auVar65 = local_8a0._0_16_;
            }
            else {
              auVar67 = vsqrtss_avx(auVar67,auVar67);
              fVar211 = auVar67._0_4_;
              auVar67 = ZEXT416(*(uint *)(local_320 + (uint)(iVar18 << 2)));
              auVar65 = ZEXT416(*(uint *)(local_1a0 + (uint)(iVar18 << 2)));
            }
            auVar67 = vinsertps_avx(auVar67,auVar65,0x10);
            bVar60 = true;
            uVar61 = 0;
            do {
              uVar124 = auVar67._0_4_;
              auVar130._4_4_ = uVar124;
              auVar130._0_4_ = uVar124;
              auVar130._8_4_ = uVar124;
              auVar130._12_4_ = uVar124;
              auVar68 = vfmadd132ps_fma(auVar130,ZEXT816(0) << 0x40,local_500._0_16_);
              auVar65 = vmovshdup_avx(auVar67);
              fVar201 = auVar65._0_4_;
              fVar202 = 1.0 - fVar201;
              fVar180 = fVar201 * fVar201;
              auVar234 = SUB6416(ZEXT464(0x40400000),0);
              auVar71 = SUB6416(ZEXT464(0xc0a00000),0);
              auVar69 = vfmadd213ss_fma(auVar234,auVar65,auVar71);
              auVar73 = vfmadd213ss_fma(auVar69,ZEXT416((uint)fVar180),
                                        SUB6416(ZEXT464(0x40000000),0));
              auVar70 = vfmadd213ss_fma(auVar234,ZEXT416((uint)fVar202),auVar71);
              auVar70 = vfmadd213ss_fma(auVar70,ZEXT416((uint)(fVar202 * fVar202)),
                                        SUB6416(ZEXT464(0x40000000),0));
              fVar198 = fVar202 * fVar202 * -fVar201 * 0.5;
              fVar199 = auVar73._0_4_ * 0.5;
              fVar200 = auVar70._0_4_ * 0.5;
              fVar201 = fVar201 * fVar201 * -fVar202 * 0.5;
              auVar183._0_4_ = fVar201 * (float)local_5a0._0_4_;
              auVar183._4_4_ = fVar201 * (float)local_5a0._4_4_;
              auVar183._8_4_ = fVar201 * fStack_598;
              auVar183._12_4_ = fVar201 * fStack_594;
              auVar207._4_4_ = fVar200;
              auVar207._0_4_ = fVar200;
              auVar207._8_4_ = fVar200;
              auVar207._12_4_ = fVar200;
              auVar73 = vfmadd132ps_fma(auVar207,auVar183,local_560._0_16_);
              auVar163._4_4_ = fVar199;
              auVar163._0_4_ = fVar199;
              auVar163._8_4_ = fVar199;
              auVar163._12_4_ = fVar199;
              auVar73 = vfmadd132ps_fma(auVar163,auVar73,local_580._0_16_);
              auVar184._4_4_ = fVar198;
              auVar184._0_4_ = fVar198;
              auVar184._8_4_ = fVar198;
              auVar184._12_4_ = fVar198;
              auVar73 = vfmadd132ps_fma(auVar184,auVar73,local_540._0_16_);
              auVar70 = vfmadd231ss_fma(auVar71,auVar65,ZEXT416(0x41100000));
              local_440._0_16_ = auVar70;
              auVar70 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc1100000),0),auVar65,ZEXT416(0x40800000));
              local_460._0_16_ = auVar70;
              local_8e0._0_16_ = auVar65;
              auVar65 = vfmadd213ss_fma(auVar234,auVar65,ZEXT416(0xbf800000));
              local_480._0_16_ = auVar65;
              local_420._0_16_ = auVar73;
              auVar65 = vsubps_avx(auVar68,auVar73);
              local_8a0._0_16_ = auVar65;
              auVar65 = vdpps_avx(auVar65,auVar65,0x7f);
              local_7e0._0_16_ = auVar65;
              local_520._0_16_ = auVar67;
              if (auVar65._0_4_ < 0.0) {
                local_680._0_4_ = auVar69._0_4_;
                _local_6a0 = ZEXT416((uint)fVar202);
                local_5c0._0_4_ = fVar180;
                local_860._0_4_ = fVar202 * -2.0;
                auVar231._0_4_ = sqrtf(auVar65._0_4_);
                auVar231._4_60_ = extraout_var;
                auVar69 = ZEXT416((uint)local_680._0_4_);
                auVar67 = auVar231._0_16_;
                auVar65 = _local_6a0;
              }
              else {
                auVar67 = vsqrtss_avx(auVar65,auVar65);
                local_860._0_4_ = fVar202 * -2.0;
                local_5c0._0_4_ = fVar180;
                auVar65 = ZEXT416((uint)fVar202);
              }
              fVar198 = auVar65._0_4_;
              fVar180 = local_8e0._0_4_;
              auVar70 = vfnmadd231ss_fma(ZEXT416((uint)(fVar180 * (fVar198 + fVar198))),auVar65,
                                         auVar65);
              auVar65 = vfmadd213ss_fma(auVar69,ZEXT416((uint)(fVar180 + fVar180)),
                                        ZEXT416((uint)(fVar180 * fVar180 * 3.0)));
              auVar68 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),local_8e0._0_16_,
                                        SUB6416(ZEXT464(0x40000000),0));
              auVar73 = vfmadd231ss_fma(ZEXT416((uint)(fVar198 * fVar198 * -3.0)),
                                        ZEXT416((uint)(fVar198 + fVar198)),auVar68);
              auVar68 = vfmadd213ss_fma(ZEXT416((uint)local_860._0_4_),local_8e0._0_16_,
                                        ZEXT416((uint)local_5c0._0_4_));
              fVar180 = auVar70._0_4_ * 0.5;
              fVar198 = auVar65._0_4_ * 0.5;
              fVar199 = auVar73._0_4_ * 0.5;
              fVar200 = auVar68._0_4_ * 0.5;
              auVar185._0_4_ = fVar200 * (float)local_5a0._0_4_;
              auVar185._4_4_ = fVar200 * (float)local_5a0._4_4_;
              auVar185._8_4_ = fVar200 * fStack_598;
              auVar185._12_4_ = fVar200 * fStack_594;
              auVar164._4_4_ = fVar199;
              auVar164._0_4_ = fVar199;
              auVar164._8_4_ = fVar199;
              auVar164._12_4_ = fVar199;
              auVar65 = vfmadd132ps_fma(auVar164,auVar185,local_560._0_16_);
              auVar145._4_4_ = fVar198;
              auVar145._0_4_ = fVar198;
              auVar145._8_4_ = fVar198;
              auVar145._12_4_ = fVar198;
              auVar65 = vfmadd132ps_fma(auVar145,auVar65,local_580._0_16_);
              auVar246._4_4_ = fVar180;
              auVar246._0_4_ = fVar180;
              auVar246._8_4_ = fVar180;
              auVar246._12_4_ = fVar180;
              local_680._0_16_ = vfmadd132ps_fma(auVar246,auVar65,local_540._0_16_);
              local_5c0._0_16_ = vdpps_avx(local_680._0_16_,local_680._0_16_,0x7f);
              auVar44._12_4_ = 0;
              auVar44._0_12_ = ZEXT812(0);
              fVar180 = local_5c0._0_4_;
              local_870 = vrsqrt14ss_avx512f(auVar44 << 0x20,ZEXT416((uint)fVar180));
              fVar198 = local_870._0_4_;
              local_860 = vrcp14ss_avx512f(auVar44 << 0x20,ZEXT416((uint)fVar180));
              auVar20._8_4_ = 0x80000000;
              auVar20._0_8_ = 0x8000000080000000;
              auVar20._12_4_ = 0x80000000;
              auVar68 = vxorps_avx512vl(local_5c0._0_16_,auVar20);
              auVar65 = vfnmadd213ss_fma(local_860,local_5c0._0_16_,SUB6416(ZEXT464(0x40000000),0));
              local_6a0._0_4_ = auVar67._0_4_;
              if (fVar180 < auVar68._0_4_) {
                local_880._0_4_ = fVar180 * -0.5;
                fVar199 = sqrtf(fVar180);
                auVar67 = ZEXT416((uint)local_6a0._0_4_);
                fVar180 = (float)local_880._0_4_;
                auVar68 = local_680._0_16_;
              }
              else {
                auVar68 = vsqrtss_avx(local_5c0._0_16_,local_5c0._0_16_);
                fVar199 = auVar68._0_4_;
                fVar180 = fVar180 * -0.5;
                auVar68 = local_680._0_16_;
              }
              fVar200 = local_870._0_4_;
              fVar180 = fVar198 * 1.5 + fVar180 * fVar200 * fVar200 * fVar200;
              local_870._0_4_ = auVar68._0_4_ * fVar180;
              local_870._4_4_ = auVar68._4_4_ * fVar180;
              local_870._8_4_ = auVar68._8_4_ * fVar180;
              local_870._12_4_ = auVar68._12_4_ * fVar180;
              auVar73 = vdpps_avx(local_8a0._0_16_,local_870,0x7f);
              fVar200 = auVar67._0_4_;
              auVar131._0_4_ = auVar73._0_4_ * auVar73._0_4_;
              auVar131._4_4_ = auVar73._4_4_ * auVar73._4_4_;
              auVar131._8_4_ = auVar73._8_4_ * auVar73._8_4_;
              auVar131._12_4_ = auVar73._12_4_ * auVar73._12_4_;
              auVar69 = vsubps_avx512vl(local_7e0._0_16_,auVar131);
              fVar198 = auVar69._0_4_;
              auVar146._4_12_ = ZEXT812(0) << 0x20;
              auVar146._0_4_ = fVar198;
              auVar70 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar146);
              auVar71 = vmulss_avx512f(auVar69,ZEXT416(0xbf000000));
              if (fVar198 < 0.0) {
                local_880 = auVar73;
                local_4b0 = fVar180;
                fStack_4ac = fVar180;
                fStack_4a8 = fVar180;
                fStack_4a4 = fVar180;
                local_4a0 = auVar70;
                fVar212 = sqrtf(fVar198);
                auVar71 = ZEXT416(auVar71._0_4_);
                auVar67 = ZEXT416((uint)local_6a0._0_4_);
                auVar69 = local_4a0;
                auVar68 = local_680._0_16_;
                auVar73 = local_880;
                fVar180 = local_4b0;
                fVar198 = fStack_4ac;
                fVar201 = fStack_4a8;
                fVar202 = fStack_4a4;
              }
              else {
                auVar69 = vsqrtss_avx(auVar69,auVar69);
                fVar212 = auVar69._0_4_;
                auVar69 = auVar70;
                fVar198 = fVar180;
                fVar201 = fVar180;
                fVar202 = fVar180;
              }
              auVar244 = ZEXT1664(local_8a0._0_16_);
              auVar256 = ZEXT3264(local_640);
              auVar259 = ZEXT3264(local_660);
              auVar251 = ZEXT3264(local_6c0);
              auVar252 = ZEXT3264(local_6e0);
              auVar253 = ZEXT3264(local_800);
              auVar254 = ZEXT3264(local_700);
              auVar255 = ZEXT3264(local_820);
              auVar257 = ZEXT3264(local_840);
              auVar258 = ZEXT3264(local_720);
              auVar260 = ZEXT3264(local_740);
              auVar261 = ZEXT3264(local_760);
              auVar262 = ZEXT3264(local_780);
              auVar147._0_4_ = (float)local_480._0_4_ * (float)local_5a0._0_4_;
              auVar147._4_4_ = (float)local_480._0_4_ * (float)local_5a0._4_4_;
              auVar147._8_4_ = (float)local_480._0_4_ * fStack_598;
              auVar147._12_4_ = (float)local_480._0_4_ * fStack_594;
              auVar165._4_4_ = local_460._0_4_;
              auVar165._0_4_ = local_460._0_4_;
              auVar165._8_4_ = local_460._0_4_;
              auVar165._12_4_ = local_460._0_4_;
              auVar234 = vfmadd132ps_fma(auVar165,auVar147,local_560._0_16_);
              auVar148._4_4_ = local_440._0_4_;
              auVar148._0_4_ = local_440._0_4_;
              auVar148._8_4_ = local_440._0_4_;
              auVar148._12_4_ = local_440._0_4_;
              auVar234 = vfmadd132ps_fma(auVar148,auVar234,local_580._0_16_);
              auVar13 = vfmadd213ss_fma(local_8e0._0_16_,SUB6416(ZEXT464(0xc0400000),0),
                                        ZEXT416(0x40000000));
              uVar124 = auVar13._0_4_;
              auVar166._4_4_ = uVar124;
              auVar166._0_4_ = uVar124;
              auVar166._8_4_ = uVar124;
              auVar166._12_4_ = uVar124;
              auVar234 = vfmadd132ps_fma(auVar166,auVar234,local_540._0_16_);
              auVar149._0_4_ = auVar234._0_4_ * (float)local_5c0._0_4_;
              auVar149._4_4_ = auVar234._4_4_ * (float)local_5c0._0_4_;
              auVar149._8_4_ = auVar234._8_4_ * (float)local_5c0._0_4_;
              auVar149._12_4_ = auVar234._12_4_ * (float)local_5c0._0_4_;
              auVar234 = vdpps_avx(auVar68,auVar234,0x7f);
              fVar203 = auVar234._0_4_;
              auVar167._0_4_ = auVar68._0_4_ * fVar203;
              auVar167._4_4_ = auVar68._4_4_ * fVar203;
              auVar167._8_4_ = auVar68._8_4_ * fVar203;
              auVar167._12_4_ = auVar68._12_4_ * fVar203;
              auVar13 = vsubps_avx(auVar149,auVar167);
              fVar203 = auVar65._0_4_ * (float)local_860._0_4_;
              auVar234 = vmaxss_avx(ZEXT416((uint)fVar204),
                                    ZEXT416((uint)(local_520._0_4_ * fVar211 * 1.9073486e-06)));
              auVar21._8_4_ = 0x80000000;
              auVar21._0_8_ = 0x8000000080000000;
              auVar21._12_4_ = 0x80000000;
              auVar113._16_16_ = local_780._16_16_;
              auVar72 = vxorps_avx512vl(auVar68,auVar21);
              auVar168._0_4_ = fVar180 * auVar13._0_4_ * fVar203;
              auVar168._4_4_ = fVar198 * auVar13._4_4_ * fVar203;
              auVar168._8_4_ = fVar201 * auVar13._8_4_ * fVar203;
              auVar168._12_4_ = fVar202 * auVar13._12_4_ * fVar203;
              auVar65 = vdpps_avx(auVar72,local_870,0x7f);
              auVar13 = vfmadd213ss_fma(auVar67,ZEXT416((uint)fVar204),auVar234);
              auVar67 = vdpps_avx(local_8a0._0_16_,auVar168,0x7f);
              auVar13 = vfmadd213ss_fma(ZEXT416((uint)(fVar200 + 1.0)),
                                        ZEXT416((uint)(fVar204 / fVar199)),auVar13);
              fVar180 = auVar65._0_4_ + auVar67._0_4_;
              auVar67 = vdpps_avx(local_500._0_16_,local_870,0x7f);
              auVar65 = vdpps_avx(local_8a0._0_16_,auVar72,0x7f);
              auVar71 = vmulss_avx512f(auVar71,auVar69);
              fVar198 = auVar70._0_4_ * 1.5 + auVar71._0_4_ * auVar69._0_4_ * auVar69._0_4_;
              auVar69 = vdpps_avx(local_8a0._0_16_,local_500._0_16_,0x7f);
              auVar71 = vfnmadd231ss_fma(auVar65,auVar73,ZEXT416((uint)fVar180));
              auVar69 = vfnmadd231ss_fma(auVar69,auVar73,auVar67);
              auVar65 = vpermilps_avx(local_420._0_16_,0xff);
              fVar212 = fVar212 - auVar65._0_4_;
              auVar70 = vshufps_avx(auVar68,auVar68,0xff);
              auVar65 = vfmsub213ss_fma(auVar71,ZEXT416((uint)fVar198),auVar70);
              auVar235._8_4_ = 0x80000000;
              auVar235._0_8_ = 0x8000000080000000;
              auVar235._12_4_ = 0x80000000;
              auVar236 = ZEXT1664(auVar235);
              auVar227._0_8_ = auVar65._0_8_ ^ 0x8000000080000000;
              auVar227._8_4_ = auVar65._8_4_ ^ 0x80000000;
              auVar227._12_4_ = auVar65._12_4_ ^ 0x80000000;
              auVar69 = ZEXT416((uint)(auVar69._0_4_ * fVar198));
              auVar71 = vfmsub231ss_fma(ZEXT416((uint)(auVar67._0_4_ * auVar65._0_4_)),
                                        ZEXT416((uint)fVar180),auVar69);
              auVar65 = vinsertps_avx(auVar227,auVar69,0x1c);
              auVar219._0_8_ = auVar67._0_8_ ^ 0x8000000080000000;
              auVar219._8_4_ = auVar67._8_4_ ^ 0x80000000;
              auVar219._12_4_ = auVar67._12_4_ ^ 0x80000000;
              auVar69 = vinsertps_avx(ZEXT416((uint)fVar180),auVar219,0x10);
              auVar186._0_4_ = auVar71._0_4_;
              auVar186._4_4_ = auVar186._0_4_;
              auVar186._8_4_ = auVar186._0_4_;
              auVar186._12_4_ = auVar186._0_4_;
              auVar67 = vdivps_avx(auVar65,auVar186);
              auVar65 = vdivps_avx(auVar69,auVar186);
              fVar180 = auVar73._0_4_;
              auVar187._0_4_ = fVar180 * auVar67._0_4_ + fVar212 * auVar65._0_4_;
              auVar187._4_4_ = fVar180 * auVar67._4_4_ + fVar212 * auVar65._4_4_;
              auVar187._8_4_ = fVar180 * auVar67._8_4_ + fVar212 * auVar65._8_4_;
              auVar187._12_4_ = fVar180 * auVar67._12_4_ + fVar212 * auVar65._12_4_;
              auVar67 = vsubps_avx(local_520._0_16_,auVar187);
              auVar22._8_4_ = 0x7fffffff;
              auVar22._0_8_ = 0x7fffffff7fffffff;
              auVar22._12_4_ = 0x7fffffff;
              auVar65 = vandps_avx512vl(auVar73,auVar22);
              fVar180 = (float)local_8c0._0_4_;
              fVar198 = (float)local_8c0._4_4_;
              fVar199 = fStack_8b8;
              fVar200 = fStack_8b4;
              fVar201 = fStack_8b0;
              fVar202 = fStack_8ac;
              fVar203 = fStack_8a8;
              fVar214 = fStack_8a4;
              if (auVar65._0_4_ < auVar13._0_4_) {
                auVar65 = vfmadd231ss_fma(ZEXT416((uint)(auVar13._0_4_ + auVar234._0_4_)),local_4c0,
                                          ZEXT416(0x36000000));
                auVar23._8_4_ = 0x7fffffff;
                auVar23._0_8_ = 0x7fffffff7fffffff;
                auVar23._12_4_ = 0x7fffffff;
                auVar73 = vandps_avx512vl(ZEXT416((uint)fVar212),auVar23);
                if (auVar73._0_4_ < auVar65._0_4_) {
                  fVar211 = auVar67._0_4_ + (float)local_4d0._0_4_;
                  bVar54 = 0;
                  if (((ray->org).field_0.m128[3] <= fVar211) && (bVar54 = 0, fVar211 <= ray->tfar))
                  {
                    auVar67 = vmovshdup_avx(auVar67);
                    bVar54 = 0;
                    fVar212 = auVar67._0_4_;
                    if ((0.0 <= fVar212) && (fVar212 <= 1.0)) {
                      auVar45._12_4_ = 0;
                      auVar45._0_12_ = ZEXT412(0);
                      auVar113._4_12_ = ZEXT412(0);
                      auVar113._0_4_ = local_7e0._0_4_;
                      auVar67 = vrsqrt14ss_avx512f(auVar45 << 0x20,auVar113._0_16_);
                      fVar213 = auVar67._0_4_;
                      auVar67 = vmulss_avx512f(local_7e0._0_16_,ZEXT416(0xbf000000));
                      pGVar4 = (context->scene->geometries).items[local_8e8].ptr;
                      if ((pGVar4->mask & ray->mask) == 0) {
                        bVar54 = 0;
                      }
                      else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                              (bVar54 = 1, pGVar4->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                        local_8e0._0_4_ = ray->tfar;
                        fVar180 = fVar213 * 1.5 + auVar67._0_4_ * fVar213 * fVar213 * fVar213;
                        auVar188._0_4_ = local_8a0._0_4_ * fVar180;
                        auVar188._4_4_ = local_8a0._4_4_ * fVar180;
                        auVar188._8_4_ = local_8a0._8_4_ * fVar180;
                        auVar188._12_4_ = local_8a0._12_4_ * fVar180;
                        auVar73 = vfmadd213ps_fma(auVar70,auVar188,auVar68);
                        auVar67 = vshufps_avx(auVar188,auVar188,0xc9);
                        auVar65 = vshufps_avx(auVar68,auVar68,0xc9);
                        auVar189._0_4_ = auVar188._0_4_ * auVar65._0_4_;
                        auVar189._4_4_ = auVar188._4_4_ * auVar65._4_4_;
                        auVar189._8_4_ = auVar188._8_4_ * auVar65._8_4_;
                        auVar189._12_4_ = auVar188._12_4_ * auVar65._12_4_;
                        auVar68 = vfmsub231ps_fma(auVar189,auVar68,auVar67);
                        auVar67 = vshufps_avx(auVar68,auVar68,0xc9);
                        auVar65 = vshufps_avx(auVar73,auVar73,0xc9);
                        auVar68 = vshufps_avx(auVar68,auVar68,0xd2);
                        auVar132._0_4_ = auVar73._0_4_ * auVar68._0_4_;
                        auVar132._4_4_ = auVar73._4_4_ * auVar68._4_4_;
                        auVar132._8_4_ = auVar73._8_4_ * auVar68._8_4_;
                        auVar132._12_4_ = auVar73._12_4_ * auVar68._12_4_;
                        auVar65 = vfmsub231ps_fma(auVar132,auVar67,auVar65);
                        auVar67 = vshufps_avx(auVar65,auVar65,0xe9);
                        local_620 = vmovlps_avx(auVar67);
                        local_618 = auVar65._0_4_;
                        local_614 = fVar212;
                        local_610 = 0;
                        local_60c = (int)local_5e8;
                        local_608 = (int)local_8e8;
                        local_604 = context->user->instID[0];
                        local_600 = context->user->instPrimID[0];
                        ray->tfar = fVar211;
                        local_8f0 = -1;
                        local_7b0.valid = &local_8f0;
                        local_7b0.geometryUserPtr = pGVar4->userPtr;
                        local_7b0.context = context->user;
                        local_7b0.ray = (RTCRayN *)ray;
                        local_7b0.hit = (RTCHitN *)&local_620;
                        local_7b0.N = 1;
                        if (pGVar4->occlusionFilterN == (RTCFilterFunctionN)0x0) {
LAB_01aba920:
                          p_Var5 = context->args->filter;
                          if ((p_Var5 != (RTCFilterFunctionN)0x0) &&
                             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              (((pGVar4->field_8).field_0x2 & 0x40) != 0)))) {
                            auVar236 = ZEXT1664(auVar236._0_16_);
                            auVar244 = ZEXT1664(auVar244._0_16_);
                            (*p_Var5)(&local_7b0);
                            if (*local_7b0.valid == 0) goto LAB_01aba976;
                          }
                          bVar54 = 1;
                        }
                        else {
                          auVar236 = ZEXT1664(auVar235);
                          auVar244 = ZEXT1664(local_8a0._0_16_);
                          (*pGVar4->occlusionFilterN)(&local_7b0);
                          if (*local_7b0.valid != 0) goto LAB_01aba920;
LAB_01aba976:
                          ray->tfar = (float)local_8e0._0_4_;
                          bVar54 = 0;
                        }
                        auVar256 = ZEXT3264(local_640);
                        auVar259 = ZEXT3264(local_660);
                        auVar251 = ZEXT3264(local_6c0);
                        auVar252 = ZEXT3264(local_6e0);
                        auVar253 = ZEXT3264(local_800);
                        auVar254 = ZEXT3264(local_700);
                        auVar255 = ZEXT3264(local_820);
                        auVar257 = ZEXT3264(local_840);
                        auVar258 = ZEXT3264(local_720);
                        auVar260 = ZEXT3264(local_740);
                        auVar261 = ZEXT3264(local_760);
                        auVar262 = ZEXT3264(local_780);
                        fVar180 = (float)local_8c0._0_4_;
                        fVar198 = (float)local_8c0._4_4_;
                        fVar199 = fStack_8b8;
                        fVar200 = fStack_8b4;
                        fVar201 = fStack_8b0;
                        fVar202 = fStack_8ac;
                        fVar203 = fStack_8a8;
                        fVar214 = fStack_8a4;
                      }
                    }
                  }
                  goto LAB_01aba716;
                }
              }
              bVar60 = uVar61 < 4;
              uVar61 = uVar61 + 1;
            } while (uVar61 != 5);
            bVar60 = false;
            bVar54 = 5;
LAB_01aba716:
            bVar59 = (bool)(bVar59 | bVar60 & bVar54);
            fVar211 = ray->tfar;
            auVar141._4_4_ = fVar211;
            auVar141._0_4_ = fVar211;
            auVar141._8_4_ = fVar211;
            auVar141._12_4_ = fVar211;
            auVar141._16_4_ = fVar211;
            auVar141._20_4_ = fVar211;
            auVar141._24_4_ = fVar211;
            auVar141._28_4_ = fVar211;
            auVar50._4_4_ = fStack_3bc;
            auVar50._0_4_ = local_3c0;
            auVar50._8_4_ = fStack_3b8;
            auVar50._12_4_ = fStack_3b4;
            auVar50._16_4_ = fStack_3b0;
            auVar50._20_4_ = fStack_3ac;
            auVar50._24_4_ = fStack_3a8;
            auVar50._28_4_ = fStack_3a4;
            uVar14 = vcmpps_avx512vl(auVar141,auVar50,0xd);
            bVar55 = ~('\x01' << ((byte)iVar18 & 0x1f)) & bVar55 & (byte)uVar14;
          } while (bVar55 != 0);
        }
        auVar231 = ZEXT3264(local_360);
        bVar55 = (byte)local_8ea | (byte)local_848;
        auVar158._0_4_ = fVar180 + local_400._0_4_;
        auVar158._4_4_ = fVar198 + local_400._4_4_;
        auVar158._8_4_ = fVar199 + local_400._8_4_;
        auVar158._12_4_ = fVar200 + local_400._12_4_;
        auVar158._16_4_ = fVar201 + local_400._16_4_;
        auVar158._20_4_ = fVar202 + local_400._20_4_;
        auVar158._24_4_ = fVar203 + local_400._24_4_;
        auVar158._28_4_ = fVar214 + local_400._28_4_;
        uVar14 = vcmpps_avx512vl(auVar158,auVar141,2);
        bVar52 = (byte)uVar15 & bVar52 & (byte)uVar14;
        auVar159._8_4_ = 2;
        auVar159._0_8_ = 0x200000002;
        auVar159._12_4_ = 2;
        auVar159._16_4_ = 2;
        auVar159._20_4_ = 2;
        auVar159._24_4_ = 2;
        auVar159._28_4_ = 2;
        auVar33._8_4_ = 3;
        auVar33._0_8_ = 0x300000003;
        auVar33._12_4_ = 3;
        auVar33._16_4_ = 3;
        auVar33._20_4_ = 3;
        auVar33._24_4_ = 3;
        auVar33._28_4_ = 3;
        auVar74 = vpblendmd_avx512vl(auVar159,auVar33);
        local_400._0_4_ = (uint)(bVar55 & 1) * auVar74._0_4_ | (uint)!(bool)(bVar55 & 1) * 2;
        bVar60 = (bool)(bVar55 >> 1 & 1);
        local_400._4_4_ = (uint)bVar60 * auVar74._4_4_ | (uint)!bVar60 * 2;
        bVar60 = (bool)(bVar55 >> 2 & 1);
        local_400._8_4_ = (uint)bVar60 * auVar74._8_4_ | (uint)!bVar60 * 2;
        bVar60 = (bool)(bVar55 >> 3 & 1);
        local_400._12_4_ = (uint)bVar60 * auVar74._12_4_ | (uint)!bVar60 * 2;
        bVar60 = (bool)(bVar55 >> 4 & 1);
        local_400._16_4_ = (uint)bVar60 * auVar74._16_4_ | (uint)!bVar60 * 2;
        bVar60 = (bool)(bVar55 >> 5 & 1);
        local_400._20_4_ = (uint)bVar60 * auVar74._20_4_ | (uint)!bVar60 * 2;
        bVar60 = (bool)(bVar55 >> 6 & 1);
        local_400._24_4_ = (uint)bVar60 * auVar74._24_4_ | (uint)!bVar60 * 2;
        local_400._28_4_ = (uint)(bVar55 >> 7) * auVar74._28_4_ | (uint)!(bool)(bVar55 >> 7) * 2;
        uVar14 = vpcmpd_avx512vl(local_380,local_400,5);
        bVar55 = (byte)uVar14 & bVar52;
        if (bVar55 != 0) {
          auVar65 = vminps_avx(local_540._0_16_,local_580._0_16_);
          auVar67 = vmaxps_avx(local_540._0_16_,local_580._0_16_);
          auVar68 = vminps_avx(local_560._0_16_,local_5a0._0_16_);
          auVar73 = vminps_avx(auVar65,auVar68);
          auVar65 = vmaxps_avx(local_560._0_16_,local_5a0._0_16_);
          auVar68 = vmaxps_avx(auVar67,auVar65);
          auVar169._8_4_ = 0x7fffffff;
          auVar169._0_8_ = 0x7fffffff7fffffff;
          auVar169._12_4_ = 0x7fffffff;
          auVar67 = vandps_avx(auVar73,auVar169);
          auVar65 = vandps_avx(auVar68,auVar169);
          auVar67 = vmaxps_avx(auVar67,auVar65);
          auVar65 = vmovshdup_avx(auVar67);
          auVar65 = vmaxss_avx(auVar65,auVar67);
          auVar67 = vshufpd_avx(auVar67,auVar67,1);
          auVar67 = vmaxss_avx(auVar67,auVar65);
          fVar204 = auVar67._0_4_ * 1.9073486e-06;
          local_4c0 = vshufps_avx(auVar68,auVar68,0xff);
          local_3c0 = fVar180 + local_360._0_4_;
          fStack_3bc = fVar198 + local_360._4_4_;
          fStack_3b8 = fVar199 + local_360._8_4_;
          fStack_3b4 = fVar200 + local_360._12_4_;
          fStack_3b0 = fVar201 + local_360._16_4_;
          fStack_3ac = fVar202 + local_360._20_4_;
          fStack_3a8 = fVar203 + local_360._24_4_;
          fStack_3a4 = fVar214 + local_360._28_4_;
          _local_5e0 = local_360;
          do {
            auVar78 = local_8e0;
            auVar142._8_4_ = 0x7f800000;
            auVar142._0_8_ = 0x7f8000007f800000;
            auVar142._12_4_ = 0x7f800000;
            auVar142._16_4_ = 0x7f800000;
            auVar142._20_4_ = 0x7f800000;
            auVar142._24_4_ = 0x7f800000;
            auVar142._28_4_ = 0x7f800000;
            auVar74 = vblendmps_avx512vl(auVar142,auVar231._0_32_);
            auVar114._0_4_ =
                 (uint)(bVar55 & 1) * auVar74._0_4_ | (uint)!(bool)(bVar55 & 1) * 0x7f800000;
            bVar60 = (bool)(bVar55 >> 1 & 1);
            auVar114._4_4_ = (uint)bVar60 * auVar74._4_4_ | (uint)!bVar60 * 0x7f800000;
            bVar60 = (bool)(bVar55 >> 2 & 1);
            auVar114._8_4_ = (uint)bVar60 * auVar74._8_4_ | (uint)!bVar60 * 0x7f800000;
            bVar60 = (bool)(bVar55 >> 3 & 1);
            auVar114._12_4_ = (uint)bVar60 * auVar74._12_4_ | (uint)!bVar60 * 0x7f800000;
            bVar60 = (bool)(bVar55 >> 4 & 1);
            auVar114._16_4_ = (uint)bVar60 * auVar74._16_4_ | (uint)!bVar60 * 0x7f800000;
            bVar60 = (bool)(bVar55 >> 5 & 1);
            auVar114._20_4_ = (uint)bVar60 * auVar74._20_4_ | (uint)!bVar60 * 0x7f800000;
            bVar60 = (bool)(bVar55 >> 6 & 1);
            auVar114._24_4_ = (uint)bVar60 * auVar74._24_4_ | (uint)!bVar60 * 0x7f800000;
            auVar114._28_4_ =
                 (uint)(bVar55 >> 7) * auVar74._28_4_ | (uint)!(bool)(bVar55 >> 7) * 0x7f800000;
            auVar74 = vshufps_avx(auVar114,auVar114,0xb1);
            auVar74 = vminps_avx(auVar114,auVar74);
            auVar77 = vshufpd_avx(auVar74,auVar74,5);
            auVar74 = vminps_avx(auVar74,auVar77);
            auVar77 = vpermpd_avx2(auVar74,0x4e);
            auVar74 = vminps_avx(auVar74,auVar77);
            uVar14 = vcmpps_avx512vl(auVar114,auVar74,0);
            bVar53 = (byte)uVar14 & bVar55;
            bVar54 = bVar55;
            if (bVar53 != 0) {
              bVar54 = bVar53;
            }
            iVar18 = 0;
            for (uVar62 = (uint)bVar54; (uVar62 & 1) == 0; uVar62 = uVar62 >> 1 | 0x80000000) {
              iVar18 = iVar18 + 1;
            }
            aVar1 = (ray->dir).field_0;
            local_500._0_16_ = (undefined1  [16])aVar1;
            auVar67 = vdpps_avx((undefined1  [16])aVar1,(undefined1  [16])aVar1,0x7f);
            if (auVar67._0_4_ < 0.0) {
              local_8e0[1] = 0;
              local_8e0[0] = bVar55;
              local_8e0._2_30_ = auVar78._2_30_;
              local_8a0._0_16_ = ZEXT416(*(uint *)(local_1c0 + (uint)(iVar18 << 2)));
              local_7e0._0_16_ = ZEXT416(*(uint *)(local_340 + (uint)(iVar18 << 2)));
              fVar180 = sqrtf(auVar67._0_4_);
              bVar55 = local_8e0[0];
              auVar67 = local_7e0._0_16_;
              auVar65 = local_8a0._0_16_;
            }
            else {
              auVar67 = vsqrtss_avx(auVar67,auVar67);
              fVar180 = auVar67._0_4_;
              auVar67 = ZEXT416(*(uint *)(local_340 + (uint)(iVar18 << 2)));
              auVar65 = ZEXT416(*(uint *)(local_1c0 + (uint)(iVar18 << 2)));
            }
            auVar67 = vinsertps_avx(auVar67,auVar65,0x10);
            bVar60 = true;
            uVar61 = 0;
            do {
              uVar124 = auVar67._0_4_;
              auVar133._4_4_ = uVar124;
              auVar133._0_4_ = uVar124;
              auVar133._8_4_ = uVar124;
              auVar133._12_4_ = uVar124;
              auVar68 = vfmadd132ps_fma(auVar133,ZEXT816(0) << 0x40,local_500._0_16_);
              auVar65 = vmovshdup_avx(auVar67);
              fVar202 = auVar65._0_4_;
              fVar203 = 1.0 - fVar202;
              fVar198 = fVar202 * fVar202;
              auVar234 = SUB6416(ZEXT464(0x40400000),0);
              auVar71 = SUB6416(ZEXT464(0xc0a00000),0);
              auVar69 = vfmadd213ss_fma(auVar234,auVar65,auVar71);
              auVar73 = vfmadd213ss_fma(auVar69,ZEXT416((uint)fVar198),
                                        SUB6416(ZEXT464(0x40000000),0));
              auVar70 = vfmadd213ss_fma(auVar234,ZEXT416((uint)fVar203),auVar71);
              auVar70 = vfmadd213ss_fma(auVar70,ZEXT416((uint)(fVar203 * fVar203)),
                                        SUB6416(ZEXT464(0x40000000),0));
              fVar199 = fVar203 * fVar203 * -fVar202 * 0.5;
              fVar200 = auVar73._0_4_ * 0.5;
              fVar201 = auVar70._0_4_ * 0.5;
              fVar202 = fVar202 * fVar202 * -fVar203 * 0.5;
              auVar190._0_4_ = fVar202 * (float)local_5a0._0_4_;
              auVar190._4_4_ = fVar202 * (float)local_5a0._4_4_;
              auVar190._8_4_ = fVar202 * fStack_598;
              auVar190._12_4_ = fVar202 * fStack_594;
              auVar208._4_4_ = fVar201;
              auVar208._0_4_ = fVar201;
              auVar208._8_4_ = fVar201;
              auVar208._12_4_ = fVar201;
              auVar73 = vfmadd132ps_fma(auVar208,auVar190,local_560._0_16_);
              auVar170._4_4_ = fVar200;
              auVar170._0_4_ = fVar200;
              auVar170._8_4_ = fVar200;
              auVar170._12_4_ = fVar200;
              auVar73 = vfmadd132ps_fma(auVar170,auVar73,local_580._0_16_);
              auVar191._4_4_ = fVar199;
              auVar191._0_4_ = fVar199;
              auVar191._8_4_ = fVar199;
              auVar191._12_4_ = fVar199;
              auVar73 = vfmadd132ps_fma(auVar191,auVar73,local_540._0_16_);
              auVar70 = vfmadd231ss_fma(auVar71,auVar65,ZEXT416(0x41100000));
              local_440._0_16_ = auVar70;
              auVar70 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc1100000),0),auVar65,ZEXT416(0x40800000));
              local_460._0_16_ = auVar70;
              local_8e0._0_16_ = auVar65;
              auVar65 = vfmadd213ss_fma(auVar234,auVar65,ZEXT416(0xbf800000));
              local_480._0_16_ = auVar65;
              local_420._0_16_ = auVar73;
              auVar65 = vsubps_avx(auVar68,auVar73);
              local_8a0._0_16_ = auVar65;
              auVar65 = vdpps_avx(auVar65,auVar65,0x7f);
              local_7e0._0_16_ = auVar65;
              local_520._0_16_ = auVar67;
              if (auVar65._0_4_ < 0.0) {
                local_680._0_4_ = auVar69._0_4_;
                _local_6a0 = ZEXT416((uint)fVar203);
                local_5c0._0_4_ = fVar198;
                local_860._0_4_ = fVar203 * -2.0;
                auVar244._0_4_ = sqrtf(auVar65._0_4_);
                auVar244._4_60_ = extraout_var_00;
                auVar69 = ZEXT416((uint)local_680._0_4_);
                auVar67 = auVar244._0_16_;
                auVar65 = _local_6a0;
              }
              else {
                auVar67 = vsqrtss_avx(auVar65,auVar65);
                local_860._0_4_ = fVar203 * -2.0;
                local_5c0._0_4_ = fVar198;
                auVar65 = ZEXT416((uint)fVar203);
              }
              fVar199 = auVar65._0_4_;
              fVar198 = local_8e0._0_4_;
              auVar70 = vfnmadd231ss_fma(ZEXT416((uint)(fVar198 * (fVar199 + fVar199))),auVar65,
                                         auVar65);
              auVar65 = vfmadd213ss_fma(auVar69,ZEXT416((uint)(fVar198 + fVar198)),
                                        ZEXT416((uint)(fVar198 * fVar198 * 3.0)));
              auVar68 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),local_8e0._0_16_,
                                        SUB6416(ZEXT464(0x40000000),0));
              auVar73 = vfmadd231ss_fma(ZEXT416((uint)(fVar199 * fVar199 * -3.0)),
                                        ZEXT416((uint)(fVar199 + fVar199)),auVar68);
              auVar68 = vfmadd213ss_fma(ZEXT416((uint)local_860._0_4_),local_8e0._0_16_,
                                        ZEXT416((uint)local_5c0._0_4_));
              fVar198 = auVar70._0_4_ * 0.5;
              fVar199 = auVar65._0_4_ * 0.5;
              fVar200 = auVar73._0_4_ * 0.5;
              fVar201 = auVar68._0_4_ * 0.5;
              auVar192._0_4_ = fVar201 * (float)local_5a0._0_4_;
              auVar192._4_4_ = fVar201 * (float)local_5a0._4_4_;
              auVar192._8_4_ = fVar201 * fStack_598;
              auVar192._12_4_ = fVar201 * fStack_594;
              auVar171._4_4_ = fVar200;
              auVar171._0_4_ = fVar200;
              auVar171._8_4_ = fVar200;
              auVar171._12_4_ = fVar200;
              auVar65 = vfmadd132ps_fma(auVar171,auVar192,local_560._0_16_);
              auVar150._4_4_ = fVar199;
              auVar150._0_4_ = fVar199;
              auVar150._8_4_ = fVar199;
              auVar150._12_4_ = fVar199;
              auVar65 = vfmadd132ps_fma(auVar150,auVar65,local_580._0_16_);
              auVar247._4_4_ = fVar198;
              auVar247._0_4_ = fVar198;
              auVar247._8_4_ = fVar198;
              auVar247._12_4_ = fVar198;
              local_680._0_16_ = vfmadd132ps_fma(auVar247,auVar65,local_540._0_16_);
              local_5c0._0_16_ = vdpps_avx(local_680._0_16_,local_680._0_16_,0x7f);
              auVar46._12_4_ = 0;
              auVar46._0_12_ = ZEXT812(0);
              fVar198 = local_5c0._0_4_;
              local_870 = vrsqrt14ss_avx512f(auVar46 << 0x20,ZEXT416((uint)fVar198));
              fVar199 = local_870._0_4_;
              local_860 = vrcp14ss_avx512f(auVar46 << 0x20,ZEXT416((uint)fVar198));
              auVar24._8_4_ = 0x80000000;
              auVar24._0_8_ = 0x8000000080000000;
              auVar24._12_4_ = 0x80000000;
              auVar68 = vxorps_avx512vl(local_5c0._0_16_,auVar24);
              auVar65 = vfnmadd213ss_fma(local_860,local_5c0._0_16_,SUB6416(ZEXT464(0x40000000),0));
              local_6a0._0_4_ = auVar67._0_4_;
              if (fVar198 < auVar68._0_4_) {
                local_880._0_4_ = fVar198 * -0.5;
                fVar200 = sqrtf(fVar198);
                auVar67 = ZEXT416((uint)local_6a0._0_4_);
                fVar198 = (float)local_880._0_4_;
                auVar68 = local_680._0_16_;
              }
              else {
                auVar68 = vsqrtss_avx(local_5c0._0_16_,local_5c0._0_16_);
                fVar200 = auVar68._0_4_;
                fVar198 = fVar198 * -0.5;
                auVar68 = local_680._0_16_;
              }
              fVar201 = local_870._0_4_;
              fVar198 = fVar199 * 1.5 + fVar198 * fVar201 * fVar201 * fVar201;
              local_870._0_4_ = auVar68._0_4_ * fVar198;
              local_870._4_4_ = auVar68._4_4_ * fVar198;
              local_870._8_4_ = auVar68._8_4_ * fVar198;
              local_870._12_4_ = auVar68._12_4_ * fVar198;
              auVar73 = vdpps_avx(local_8a0._0_16_,local_870,0x7f);
              fVar201 = auVar67._0_4_;
              auVar134._0_4_ = auVar73._0_4_ * auVar73._0_4_;
              auVar134._4_4_ = auVar73._4_4_ * auVar73._4_4_;
              auVar134._8_4_ = auVar73._8_4_ * auVar73._8_4_;
              auVar134._12_4_ = auVar73._12_4_ * auVar73._12_4_;
              auVar69 = vsubps_avx512vl(local_7e0._0_16_,auVar134);
              fVar199 = auVar69._0_4_;
              auVar151._4_12_ = ZEXT812(0) << 0x20;
              auVar151._0_4_ = fVar199;
              auVar70 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar151);
              auVar71 = vmulss_avx512f(auVar69,ZEXT416(0xbf000000));
              if (fVar199 < 0.0) {
                local_880 = auVar73;
                local_4b0 = fVar198;
                fStack_4ac = fVar198;
                fStack_4a8 = fVar198;
                fStack_4a4 = fVar198;
                local_4a0 = auVar70;
                fVar199 = sqrtf(fVar199);
                auVar71 = ZEXT416(auVar71._0_4_);
                auVar67 = ZEXT416((uint)local_6a0._0_4_);
                auVar69 = local_4a0;
                auVar68 = local_680._0_16_;
                auVar73 = local_880;
                fVar198 = local_4b0;
                fVar202 = fStack_4ac;
                fVar203 = fStack_4a8;
                fVar214 = fStack_4a4;
              }
              else {
                auVar69 = vsqrtss_avx(auVar69,auVar69);
                fVar199 = auVar69._0_4_;
                auVar69 = auVar70;
                fVar202 = fVar198;
                fVar203 = fVar198;
                fVar214 = fVar198;
              }
              auVar244 = ZEXT1664(local_8a0._0_16_);
              auVar256 = ZEXT3264(local_640);
              auVar259 = ZEXT3264(local_660);
              auVar251 = ZEXT3264(local_6c0);
              auVar252 = ZEXT3264(local_6e0);
              auVar253 = ZEXT3264(local_800);
              auVar254 = ZEXT3264(local_700);
              auVar255 = ZEXT3264(local_820);
              auVar257 = ZEXT3264(local_840);
              auVar258 = ZEXT3264(local_720);
              auVar260 = ZEXT3264(local_740);
              auVar261 = ZEXT3264(local_760);
              auVar262 = ZEXT3264(local_780);
              auVar152._0_4_ = (float)local_480._0_4_ * (float)local_5a0._0_4_;
              auVar152._4_4_ = (float)local_480._0_4_ * (float)local_5a0._4_4_;
              auVar152._8_4_ = (float)local_480._0_4_ * fStack_598;
              auVar152._12_4_ = (float)local_480._0_4_ * fStack_594;
              auVar172._4_4_ = local_460._0_4_;
              auVar172._0_4_ = local_460._0_4_;
              auVar172._8_4_ = local_460._0_4_;
              auVar172._12_4_ = local_460._0_4_;
              auVar234 = vfmadd132ps_fma(auVar172,auVar152,local_560._0_16_);
              auVar153._4_4_ = local_440._0_4_;
              auVar153._0_4_ = local_440._0_4_;
              auVar153._8_4_ = local_440._0_4_;
              auVar153._12_4_ = local_440._0_4_;
              auVar234 = vfmadd132ps_fma(auVar153,auVar234,local_580._0_16_);
              auVar13 = vfmadd213ss_fma(local_8e0._0_16_,SUB6416(ZEXT464(0xc0400000),0),
                                        ZEXT416(0x40000000));
              uVar124 = auVar13._0_4_;
              auVar173._4_4_ = uVar124;
              auVar173._0_4_ = uVar124;
              auVar173._8_4_ = uVar124;
              auVar173._12_4_ = uVar124;
              auVar234 = vfmadd132ps_fma(auVar173,auVar234,local_540._0_16_);
              auVar154._0_4_ = auVar234._0_4_ * (float)local_5c0._0_4_;
              auVar154._4_4_ = auVar234._4_4_ * (float)local_5c0._0_4_;
              auVar154._8_4_ = auVar234._8_4_ * (float)local_5c0._0_4_;
              auVar154._12_4_ = auVar234._12_4_ * (float)local_5c0._0_4_;
              auVar234 = vdpps_avx(auVar68,auVar234,0x7f);
              fVar211 = auVar234._0_4_;
              auVar174._0_4_ = auVar68._0_4_ * fVar211;
              auVar174._4_4_ = auVar68._4_4_ * fVar211;
              auVar174._8_4_ = auVar68._8_4_ * fVar211;
              auVar174._12_4_ = auVar68._12_4_ * fVar211;
              auVar13 = vsubps_avx(auVar154,auVar174);
              fVar211 = auVar65._0_4_ * (float)local_860._0_4_;
              auVar234 = vmaxss_avx(ZEXT416((uint)fVar204),
                                    ZEXT416((uint)(local_520._0_4_ * fVar180 * 1.9073486e-06)));
              auVar25._8_4_ = 0x80000000;
              auVar25._0_8_ = 0x8000000080000000;
              auVar25._12_4_ = 0x80000000;
              auVar115._16_16_ = local_780._16_16_;
              auVar72 = vxorps_avx512vl(auVar68,auVar25);
              auVar175._0_4_ = fVar198 * auVar13._0_4_ * fVar211;
              auVar175._4_4_ = fVar202 * auVar13._4_4_ * fVar211;
              auVar175._8_4_ = fVar203 * auVar13._8_4_ * fVar211;
              auVar175._12_4_ = fVar214 * auVar13._12_4_ * fVar211;
              auVar65 = vdpps_avx(auVar72,local_870,0x7f);
              auVar13 = vfmadd213ss_fma(auVar67,ZEXT416((uint)fVar204),auVar234);
              auVar67 = vdpps_avx(local_8a0._0_16_,auVar175,0x7f);
              auVar13 = vfmadd213ss_fma(ZEXT416((uint)(fVar201 + 1.0)),
                                        ZEXT416((uint)(fVar204 / fVar200)),auVar13);
              fVar198 = auVar65._0_4_ + auVar67._0_4_;
              auVar67 = vdpps_avx(local_500._0_16_,local_870,0x7f);
              auVar65 = vdpps_avx(local_8a0._0_16_,auVar72,0x7f);
              auVar71 = vmulss_avx512f(auVar71,auVar69);
              fVar200 = auVar70._0_4_ * 1.5 + auVar71._0_4_ * auVar69._0_4_ * auVar69._0_4_;
              auVar69 = vdpps_avx(local_8a0._0_16_,local_500._0_16_,0x7f);
              auVar71 = vfnmadd231ss_fma(auVar65,auVar73,ZEXT416((uint)fVar198));
              auVar69 = vfnmadd231ss_fma(auVar69,auVar73,auVar67);
              auVar65 = vpermilps_avx(local_420._0_16_,0xff);
              fVar199 = fVar199 - auVar65._0_4_;
              auVar70 = vshufps_avx(auVar68,auVar68,0xff);
              auVar65 = vfmsub213ss_fma(auVar71,ZEXT416((uint)fVar200),auVar70);
              auVar236 = ZEXT1664(CONCAT412(0x80000000,CONCAT48(0x80000000,0x8000000080000000)));
              auVar228._0_8_ = auVar65._0_8_ ^ 0x8000000080000000;
              auVar228._8_4_ = auVar65._8_4_ ^ 0x80000000;
              auVar228._12_4_ = auVar65._12_4_ ^ 0x80000000;
              auVar69 = ZEXT416((uint)(auVar69._0_4_ * fVar200));
              auVar71 = vfmsub231ss_fma(ZEXT416((uint)(auVar67._0_4_ * auVar65._0_4_)),
                                        ZEXT416((uint)fVar198),auVar69);
              auVar65 = vinsertps_avx(auVar228,auVar69,0x1c);
              auVar220._0_8_ = auVar67._0_8_ ^ 0x8000000080000000;
              auVar220._8_4_ = auVar67._8_4_ ^ 0x80000000;
              auVar220._12_4_ = auVar67._12_4_ ^ 0x80000000;
              auVar69 = vinsertps_avx(ZEXT416((uint)fVar198),auVar220,0x10);
              auVar193._0_4_ = auVar71._0_4_;
              auVar193._4_4_ = auVar193._0_4_;
              auVar193._8_4_ = auVar193._0_4_;
              auVar193._12_4_ = auVar193._0_4_;
              auVar67 = vdivps_avx(auVar65,auVar193);
              auVar65 = vdivps_avx(auVar69,auVar193);
              fVar198 = auVar73._0_4_;
              auVar194._0_4_ = fVar198 * auVar67._0_4_ + fVar199 * auVar65._0_4_;
              auVar194._4_4_ = fVar198 * auVar67._4_4_ + fVar199 * auVar65._4_4_;
              auVar194._8_4_ = fVar198 * auVar67._8_4_ + fVar199 * auVar65._8_4_;
              auVar194._12_4_ = fVar198 * auVar67._12_4_ + fVar199 * auVar65._12_4_;
              auVar67 = vsubps_avx(local_520._0_16_,auVar194);
              auVar26._8_4_ = 0x7fffffff;
              auVar26._0_8_ = 0x7fffffff7fffffff;
              auVar26._12_4_ = 0x7fffffff;
              auVar65 = vandps_avx512vl(auVar73,auVar26);
              if (auVar65._0_4_ < auVar13._0_4_) {
                auVar65 = vfmadd231ss_fma(ZEXT416((uint)(auVar13._0_4_ + auVar234._0_4_)),local_4c0,
                                          ZEXT416(0x36000000));
                auVar27._8_4_ = 0x7fffffff;
                auVar27._0_8_ = 0x7fffffff7fffffff;
                auVar27._12_4_ = 0x7fffffff;
                auVar73 = vandps_avx512vl(ZEXT416((uint)fVar199),auVar27);
                if (auVar73._0_4_ < auVar65._0_4_) {
                  fVar211 = auVar67._0_4_ + (float)local_4d0._0_4_;
                  bVar53 = 0;
                  bVar54 = 0;
                  if (fVar211 < (ray->org).field_0.m128[3]) goto LAB_01abb2af;
                  fVar212 = ray->tfar;
                  auVar236 = ZEXT464((uint)fVar212);
                  auVar231 = ZEXT3264(_local_5e0);
                  fVar180 = (float)local_8c0._0_4_;
                  fVar198 = (float)local_8c0._4_4_;
                  fVar199 = fStack_8b8;
                  fVar200 = fStack_8b4;
                  fVar201 = fStack_8b0;
                  fVar202 = fStack_8ac;
                  fVar203 = fStack_8a8;
                  fVar214 = fStack_8a4;
                  if (fVar212 < fVar211) goto LAB_01abb2b8;
                  auVar67 = vmovshdup_avx(auVar67);
                  bVar53 = 0;
                  fVar213 = auVar67._0_4_;
                  if ((fVar213 < 0.0) || (1.0 < fVar213)) goto LAB_01abb2b8;
                  auVar47._12_4_ = 0;
                  auVar47._0_12_ = ZEXT412(0);
                  auVar115._4_12_ = ZEXT412(0);
                  auVar115._0_4_ = local_7e0._0_4_;
                  auVar67 = vrsqrt14ss_avx512f(auVar47 << 0x20,auVar115._0_16_);
                  fVar215 = auVar67._0_4_;
                  auVar67 = vmulss_avx512f(local_7e0._0_16_,ZEXT416(0xbf000000));
                  pGVar4 = (context->scene->geometries).items[local_8e8].ptr;
                  if ((pGVar4->mask & ray->mask) == 0) {
                    bVar53 = 0;
                    goto LAB_01abb2b8;
                  }
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (bVar53 = 1, pGVar4->occlusionFilterN == (RTCFilterFunctionN)0x0))
                  goto LAB_01abb2b8;
                  local_8e0._0_4_ = fVar212;
                  fVar180 = fVar215 * 1.5 + auVar67._0_4_ * fVar215 * fVar215 * fVar215;
                  auVar195._0_4_ = local_8a0._0_4_ * fVar180;
                  auVar195._4_4_ = local_8a0._4_4_ * fVar180;
                  auVar195._8_4_ = local_8a0._8_4_ * fVar180;
                  auVar195._12_4_ = local_8a0._12_4_ * fVar180;
                  auVar73 = vfmadd213ps_fma(auVar70,auVar195,auVar68);
                  auVar67 = vshufps_avx(auVar195,auVar195,0xc9);
                  auVar65 = vshufps_avx(auVar68,auVar68,0xc9);
                  auVar196._0_4_ = auVar195._0_4_ * auVar65._0_4_;
                  auVar196._4_4_ = auVar195._4_4_ * auVar65._4_4_;
                  auVar196._8_4_ = auVar195._8_4_ * auVar65._8_4_;
                  auVar196._12_4_ = auVar195._12_4_ * auVar65._12_4_;
                  auVar68 = vfmsub231ps_fma(auVar196,auVar68,auVar67);
                  auVar67 = vshufps_avx(auVar68,auVar68,0xc9);
                  auVar65 = vshufps_avx(auVar73,auVar73,0xc9);
                  auVar68 = vshufps_avx(auVar68,auVar68,0xd2);
                  auVar135._0_4_ = auVar73._0_4_ * auVar68._0_4_;
                  auVar135._4_4_ = auVar73._4_4_ * auVar68._4_4_;
                  auVar135._8_4_ = auVar73._8_4_ * auVar68._8_4_;
                  auVar135._12_4_ = auVar73._12_4_ * auVar68._12_4_;
                  auVar65 = vfmsub231ps_fma(auVar135,auVar67,auVar65);
                  auVar67 = vshufps_avx(auVar65,auVar65,0xe9);
                  local_620 = vmovlps_avx(auVar67);
                  local_618 = auVar65._0_4_;
                  local_614 = fVar213;
                  local_610 = 0;
                  local_60c = (int)local_5e8;
                  local_608 = (int)local_8e8;
                  local_604 = context->user->instID[0];
                  local_600 = context->user->instPrimID[0];
                  ray->tfar = fVar211;
                  local_8f0 = -1;
                  local_7b0.valid = &local_8f0;
                  local_7b0.geometryUserPtr = pGVar4->userPtr;
                  local_7b0.context = context->user;
                  local_7b0.ray = (RTCRayN *)ray;
                  local_7b0.hit = (RTCHitN *)&local_620;
                  local_7b0.N = 1;
                  if (pGVar4->occlusionFilterN == (RTCFilterFunctionN)0x0) {
LAB_01abb4cf:
                    p_Var5 = context->args->filter;
                    if ((p_Var5 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar4->field_8).field_0x2 & 0x40) != 0)))) {
                      auVar236 = ZEXT1664(auVar236._0_16_);
                      auVar244 = ZEXT1664(auVar244._0_16_);
                      (*p_Var5)(&local_7b0);
                      if (*local_7b0.valid == 0) goto LAB_01abb525;
                    }
                    bVar54 = 1;
                  }
                  else {
                    auVar236 = ZEXT464((uint)fVar212);
                    auVar244 = ZEXT1664(local_8a0._0_16_);
                    (*pGVar4->occlusionFilterN)(&local_7b0);
                    if (*local_7b0.valid != 0) goto LAB_01abb4cf;
LAB_01abb525:
                    ray->tfar = (float)local_8e0._0_4_;
                    bVar54 = 0;
                  }
                  auVar256 = ZEXT3264(local_640);
                  auVar259 = ZEXT3264(local_660);
                  auVar251 = ZEXT3264(local_6c0);
                  auVar252 = ZEXT3264(local_6e0);
                  auVar253 = ZEXT3264(local_800);
                  auVar254 = ZEXT3264(local_700);
                  auVar255 = ZEXT3264(local_820);
                  auVar257 = ZEXT3264(local_840);
                  auVar258 = ZEXT3264(local_720);
                  auVar260 = ZEXT3264(local_740);
                  auVar261 = ZEXT3264(local_760);
                  auVar262 = ZEXT3264(local_780);
                  goto LAB_01abb2af;
                }
              }
              bVar60 = uVar61 < 4;
              uVar61 = uVar61 + 1;
            } while (uVar61 != 5);
            bVar60 = false;
            bVar54 = 5;
LAB_01abb2af:
            bVar53 = bVar54;
            auVar231 = ZEXT3264(_local_5e0);
            fVar180 = (float)local_8c0._0_4_;
            fVar198 = (float)local_8c0._4_4_;
            fVar199 = fStack_8b8;
            fVar200 = fStack_8b4;
            fVar201 = fStack_8b0;
            fVar202 = fStack_8ac;
            fVar203 = fStack_8a8;
            fVar214 = fStack_8a4;
LAB_01abb2b8:
            bVar59 = (bool)(bVar59 | bVar60 & bVar53);
            fVar211 = ray->tfar;
            auVar141._4_4_ = fVar211;
            auVar141._0_4_ = fVar211;
            auVar141._8_4_ = fVar211;
            auVar141._12_4_ = fVar211;
            auVar141._16_4_ = fVar211;
            auVar141._20_4_ = fVar211;
            auVar141._24_4_ = fVar211;
            auVar141._28_4_ = fVar211;
            auVar51._4_4_ = fStack_3bc;
            auVar51._0_4_ = local_3c0;
            auVar51._8_4_ = fStack_3b8;
            auVar51._12_4_ = fStack_3b4;
            auVar51._16_4_ = fStack_3b0;
            auVar51._20_4_ = fStack_3ac;
            auVar51._24_4_ = fStack_3a8;
            auVar51._28_4_ = fStack_3a4;
            uVar14 = vcmpps_avx512vl(auVar141,auVar51,0xd);
            bVar55 = ~('\x01' << ((byte)iVar18 & 0x1f)) & bVar55 & (byte)uVar14;
          } while (bVar55 != 0);
          auVar231 = ZEXT3264(local_360);
        }
        uVar15 = vpcmpgtd_avx512vl(local_400,local_380);
        uVar17 = vpcmpd_avx512vl(local_380,local_2e0,1);
        auVar178._0_4_ = fVar180 + (float)local_320._0_4_;
        auVar178._4_4_ = fVar198 + (float)local_320._4_4_;
        auVar178._8_4_ = fVar199 + fStack_318;
        auVar178._12_4_ = fVar200 + fStack_314;
        auVar178._16_4_ = fVar201 + fStack_310;
        auVar178._20_4_ = fVar202 + fStack_30c;
        auVar178._24_4_ = fVar203 + fStack_308;
        auVar178._28_4_ = fVar214 + fStack_304;
        uVar14 = vcmpps_avx512vl(auVar178,auVar141,2);
        bVar55 = (byte)local_844 & (byte)uVar17 & (byte)uVar14;
        auVar179._0_4_ = fVar180 + auVar231._0_4_;
        auVar179._4_4_ = fVar198 + auVar231._4_4_;
        auVar179._8_4_ = fVar199 + auVar231._8_4_;
        auVar179._12_4_ = fVar200 + auVar231._12_4_;
        auVar179._16_4_ = fVar201 + auVar231._16_4_;
        auVar179._20_4_ = fVar202 + auVar231._20_4_;
        auVar179._24_4_ = fVar203 + auVar231._24_4_;
        auVar179._28_4_ = fVar214 + auVar231._28_4_;
        uVar14 = vcmpps_avx512vl(auVar179,auVar141,2);
        bVar52 = bVar52 & (byte)uVar15 & (byte)uVar14 | bVar55;
        prim = local_490;
        if (bVar52 != 0) {
          abStack_180[uVar57 * 0x60] = bVar52;
          auVar116._0_4_ =
               (uint)(bVar55 & 1) * local_320._0_4_ |
               (uint)!(bool)(bVar55 & 1) * (int)auVar231._0_4_;
          bVar60 = (bool)(bVar55 >> 1 & 1);
          auVar116._4_4_ = (uint)bVar60 * local_320._4_4_ | (uint)!bVar60 * (int)auVar231._4_4_;
          bVar60 = (bool)(bVar55 >> 2 & 1);
          auVar116._8_4_ = (uint)bVar60 * (int)fStack_318 | (uint)!bVar60 * (int)auVar231._8_4_;
          bVar60 = (bool)(bVar55 >> 3 & 1);
          auVar116._12_4_ = (uint)bVar60 * (int)fStack_314 | (uint)!bVar60 * (int)auVar231._12_4_;
          bVar60 = (bool)(bVar55 >> 4 & 1);
          auVar116._16_4_ = (uint)bVar60 * (int)fStack_310 | (uint)!bVar60 * (int)auVar231._16_4_;
          bVar60 = (bool)(bVar55 >> 5 & 1);
          auVar116._20_4_ = (uint)bVar60 * (int)fStack_30c | (uint)!bVar60 * (int)auVar231._20_4_;
          bVar60 = (bool)(bVar55 >> 6 & 1);
          auVar116._24_4_ = (uint)bVar60 * (int)fStack_308 | (uint)!bVar60 * (int)auVar231._24_4_;
          auVar116._28_4_ =
               (uint)(bVar55 >> 7) * (int)fStack_304 |
               (uint)!(bool)(bVar55 >> 7) * (int)auVar231._28_4_;
          auVar231 = ZEXT3264(auVar116);
          *(undefined1 (*) [32])(auStack_160 + uVar57 * 0x60) = auVar116;
          uVar61 = vmovlps_avx(local_390);
          (&uStack_140)[uVar57 * 0xc] = uVar61;
          aiStack_138[uVar57 * 0x18] = local_90c + 1;
          uVar57 = (ulong)((int)uVar57 + 1);
        }
      }
    }
    fVar211 = ray->tfar;
    fVar204 = ray->tfar;
    auVar155._4_4_ = fVar204;
    auVar155._0_4_ = fVar204;
    auVar155._8_4_ = fVar204;
    auVar155._12_4_ = fVar204;
    auVar155._16_4_ = fVar204;
    auVar155._20_4_ = fVar204;
    auVar155._24_4_ = fVar204;
    auVar155._28_4_ = fVar204;
    do {
      uVar62 = (uint)uVar57;
      uVar57 = (ulong)(uVar62 - 1);
      if (uVar62 == 0) {
        if (bVar59 != false) {
          return bVar59;
        }
        auVar136._4_4_ = fVar211;
        auVar136._0_4_ = fVar211;
        auVar136._8_4_ = fVar211;
        auVar136._12_4_ = fVar211;
        uVar14 = vcmpps_avx512vl(auVar136,local_3a0,0xd);
        uVar62 = (uint)local_488 & (uint)uVar14;
        local_488 = (ulong)uVar62;
        if (uVar62 == 0) {
          return false;
        }
        goto LAB_01ab8f12;
      }
      lVar56 = uVar57 * 0x60;
      auVar74 = *(undefined1 (*) [32])(auStack_160 + lVar56);
      auVar197._0_4_ = fVar180 + auVar74._0_4_;
      auVar197._4_4_ = fVar198 + auVar74._4_4_;
      auVar197._8_4_ = fVar199 + auVar74._8_4_;
      auVar197._12_4_ = fVar200 + auVar74._12_4_;
      auVar197._16_4_ = fVar201 + auVar74._16_4_;
      auVar197._20_4_ = fVar202 + auVar74._20_4_;
      auVar197._24_4_ = fVar203 + auVar74._24_4_;
      auVar197._28_4_ = fVar214 + auVar74._28_4_;
      uVar14 = vcmpps_avx512vl(auVar197,auVar155,2);
      uVar117 = (uint)uVar14 & (uint)abStack_180[lVar56];
    } while (uVar117 == 0);
    uVar61 = (&uStack_140)[uVar57 * 0xc];
    auVar129._8_8_ = 0;
    auVar129._0_8_ = uVar61;
    auVar156._8_4_ = 0x7f800000;
    auVar156._0_8_ = 0x7f8000007f800000;
    auVar156._12_4_ = 0x7f800000;
    auVar156._16_4_ = 0x7f800000;
    auVar156._20_4_ = 0x7f800000;
    auVar156._24_4_ = 0x7f800000;
    auVar156._28_4_ = 0x7f800000;
    auVar74 = vblendmps_avx512vl(auVar156,auVar74);
    bVar52 = (byte)uVar117;
    auVar111._0_4_ = (uint)(bVar52 & 1) * auVar74._0_4_ | (uint)!(bool)(bVar52 & 1) * 0x7f800000;
    bVar60 = (bool)((byte)(uVar117 >> 1) & 1);
    auVar111._4_4_ = (uint)bVar60 * auVar74._4_4_ | (uint)!bVar60 * 0x7f800000;
    bVar60 = (bool)((byte)(uVar117 >> 2) & 1);
    auVar111._8_4_ = (uint)bVar60 * auVar74._8_4_ | (uint)!bVar60 * 0x7f800000;
    bVar60 = (bool)((byte)(uVar117 >> 3) & 1);
    auVar111._12_4_ = (uint)bVar60 * auVar74._12_4_ | (uint)!bVar60 * 0x7f800000;
    bVar60 = (bool)((byte)(uVar117 >> 4) & 1);
    auVar111._16_4_ = (uint)bVar60 * auVar74._16_4_ | (uint)!bVar60 * 0x7f800000;
    bVar60 = (bool)((byte)(uVar117 >> 5) & 1);
    auVar111._20_4_ = (uint)bVar60 * auVar74._20_4_ | (uint)!bVar60 * 0x7f800000;
    bVar60 = (bool)((byte)(uVar117 >> 6) & 1);
    auVar111._24_4_ = (uint)bVar60 * auVar74._24_4_ | (uint)!bVar60 * 0x7f800000;
    auVar111._28_4_ = (uVar117 >> 7) * auVar74._28_4_ | (uint)!SUB41(uVar117 >> 7,0) * 0x7f800000;
    auVar74 = vshufps_avx(auVar111,auVar111,0xb1);
    auVar74 = vminps_avx(auVar111,auVar74);
    auVar77 = vshufpd_avx(auVar74,auVar74,5);
    auVar74 = vminps_avx(auVar74,auVar77);
    auVar77 = vpermpd_avx2(auVar74,0x4e);
    auVar74 = vminps_avx(auVar74,auVar77);
    uVar14 = vcmpps_avx512vl(auVar111,auVar74,0);
    bVar55 = (byte)uVar14 & bVar52;
    if (bVar55 != 0) {
      uVar117 = (uint)bVar55;
    }
    uVar118 = 0;
    for (; (uVar117 & 1) == 0; uVar117 = uVar117 >> 1 | 0x80000000) {
      uVar118 = uVar118 + 1;
    }
    local_90c = aiStack_138[uVar57 * 0x18];
    bVar52 = ~('\x01' << ((byte)uVar118 & 0x1f)) & bVar52;
    abStack_180[lVar56] = bVar52;
    if (bVar52 == 0) {
      uVar62 = uVar62 - 1;
    }
    uVar124 = (undefined4)uVar61;
    auVar157._4_4_ = uVar124;
    auVar157._0_4_ = uVar124;
    auVar157._8_4_ = uVar124;
    auVar157._12_4_ = uVar124;
    auVar157._16_4_ = uVar124;
    auVar157._20_4_ = uVar124;
    auVar157._24_4_ = uVar124;
    auVar157._28_4_ = uVar124;
    auVar67 = vmovshdup_avx(auVar129);
    auVar67 = vsubps_avx(auVar67,auVar129);
    auVar138._0_4_ = auVar67._0_4_;
    auVar138._4_4_ = auVar138._0_4_;
    auVar138._8_4_ = auVar138._0_4_;
    auVar138._12_4_ = auVar138._0_4_;
    auVar138._16_4_ = auVar138._0_4_;
    auVar138._20_4_ = auVar138._0_4_;
    auVar138._24_4_ = auVar138._0_4_;
    auVar138._28_4_ = auVar138._0_4_;
    auVar67 = vfmadd132ps_fma(auVar138,auVar157,_DAT_01faff20);
    _local_320 = ZEXT1632(auVar67);
    local_390._8_8_ = 0;
    local_390._0_8_ = *(ulong *)(local_320 + (ulong)uVar118 * 4);
    uVar57 = (ulong)uVar62;
  } while( true );
}

Assistant:

static __forceinline bool occluded_t(const Precalculations& pre, Ray& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID));
         
          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }

          if (Intersector().intersect(pre,ray,context,geom,primID,a0,a1,a2,a3,Epilog(ray,context,geomID,primID)))
            return true;
          
          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
        return false;
      }